

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  long lVar61;
  byte bVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  long lVar66;
  float fVar67;
  undefined4 uVar68;
  float fVar94;
  float fVar95;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar96;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined8 uVar97;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar143;
  float fVar144;
  vint4 bi;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar145;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar147;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar181;
  float fVar182;
  vint4 ai_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar183;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  vint4 ai_1;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  vint4 ai;
  undefined1 auVar290 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar250;
  undefined1 auVar243 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar251;
  float fVar264;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar265;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar276;
  float fVar286;
  float fVar287;
  undefined1 auVar277 [16];
  float fVar288;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar289 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar297;
  float fVar308;
  float fVar309;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar310;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar325 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  int local_4dc;
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_4c0;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [32];
  undefined1 local_438 [16];
  ulong local_420;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 auStack_408 [16];
  undefined1 local_3f8 [8];
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 auStack_3a8 [16];
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  undefined1 local_2b8 [16];
  uint auStack_2a8 [4];
  undefined8 local_298;
  float local_290;
  undefined8 local_28c;
  uint local_284;
  uint local_280;
  uint local_27c;
  uint local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  uint uStack_1b8;
  float afStack_1b4 [7];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar324 [32];
  
  PVar7 = prim[1];
  uVar59 = (ulong)(byte)PVar7;
  lVar61 = uVar59 * 0x25;
  fVar67 = *(float *)(prim + lVar61 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar61 + 6));
  auVar106._0_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar106._4_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar106._8_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar106._12_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar69._0_4_ = fVar67 * auVar21._0_4_;
  auVar69._4_4_ = fVar67 * auVar21._4_4_;
  auVar69._8_4_ = fVar67 * auVar21._8_4_;
  auVar69._12_4_ = fVar67 * auVar21._12_4_;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar59 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1a + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1c + 6)));
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar311._4_4_ = auVar106._0_4_;
  auVar311._0_4_ = auVar106._0_4_;
  auVar311._8_4_ = auVar106._0_4_;
  auVar311._12_4_ = auVar106._0_4_;
  auVar290 = vshufps_avx(auVar106,auVar106,0x55);
  auVar167 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar67 = auVar167._0_4_;
  auVar266._0_4_ = fVar67 * auVar159._0_4_;
  fVar94 = auVar167._4_4_;
  auVar266._4_4_ = fVar94 * auVar159._4_4_;
  fVar148 = auVar167._8_4_;
  auVar266._8_4_ = fVar148 * auVar159._8_4_;
  fVar147 = auVar167._12_4_;
  auVar266._12_4_ = fVar147 * auVar159._12_4_;
  auVar252._0_4_ = auVar188._0_4_ * fVar67;
  auVar252._4_4_ = auVar188._4_4_ * fVar94;
  auVar252._8_4_ = auVar188._8_4_ * fVar148;
  auVar252._12_4_ = auVar188._12_4_ * fVar147;
  auVar239._0_4_ = auVar20._0_4_ * fVar67;
  auVar239._4_4_ = auVar20._4_4_ * fVar94;
  auVar239._8_4_ = auVar20._8_4_ * fVar148;
  auVar239._12_4_ = auVar20._12_4_ * fVar147;
  auVar167 = vfmadd231ps_fma(auVar266,auVar290,auVar16);
  auVar189 = vfmadd231ps_fma(auVar252,auVar290,auVar18);
  auVar290 = vfmadd231ps_fma(auVar239,auVar187,auVar290);
  auVar281 = vfmadd231ps_fma(auVar167,auVar311,auVar21);
  auVar189 = vfmadd231ps_fma(auVar189,auVar311,auVar17);
  auVar70 = vfmadd231ps_fma(auVar290,auVar19,auVar311);
  auVar312._4_4_ = auVar69._0_4_;
  auVar312._0_4_ = auVar69._0_4_;
  auVar312._8_4_ = auVar69._0_4_;
  auVar312._12_4_ = auVar69._0_4_;
  auVar290 = vshufps_avx(auVar69,auVar69,0x55);
  auVar167 = vshufps_avx(auVar69,auVar69,0xaa);
  fVar67 = auVar167._0_4_;
  auVar126._0_4_ = fVar67 * auVar159._0_4_;
  fVar94 = auVar167._4_4_;
  auVar126._4_4_ = fVar94 * auVar159._4_4_;
  fVar148 = auVar167._8_4_;
  auVar126._8_4_ = fVar148 * auVar159._8_4_;
  fVar147 = auVar167._12_4_;
  auVar126._12_4_ = fVar147 * auVar159._12_4_;
  auVar98._0_4_ = auVar188._0_4_ * fVar67;
  auVar98._4_4_ = auVar188._4_4_ * fVar94;
  auVar98._8_4_ = auVar188._8_4_ * fVar148;
  auVar98._12_4_ = auVar188._12_4_ * fVar147;
  auVar156._0_4_ = auVar20._0_4_ * fVar67;
  auVar156._4_4_ = auVar20._4_4_ * fVar94;
  auVar156._8_4_ = auVar20._8_4_ * fVar148;
  auVar156._12_4_ = auVar20._12_4_ * fVar147;
  auVar16 = vfmadd231ps_fma(auVar126,auVar290,auVar16);
  auVar159 = vfmadd231ps_fma(auVar98,auVar290,auVar18);
  auVar18 = vfmadd231ps_fma(auVar156,auVar290,auVar187);
  auVar98 = vfmadd231ps_fma(auVar16,auVar312,auVar21);
  auVar99 = vfmadd231ps_fma(auVar159,auVar312,auVar17);
  local_2b8._8_4_ = 0x7fffffff;
  local_2b8._0_8_ = 0x7fffffff7fffffff;
  local_2b8._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx(auVar281,local_2b8);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  auVar21 = vcmpps_avx(auVar21,auVar218,1);
  auVar16 = vblendvps_avx(auVar281,auVar218,auVar21);
  auVar21 = vandps_avx(auVar189,local_2b8);
  auVar21 = vcmpps_avx(auVar21,auVar218,1);
  auVar159 = vblendvps_avx(auVar189,auVar218,auVar21);
  auVar21 = vandps_avx(auVar70,local_2b8);
  auVar21 = vcmpps_avx(auVar21,auVar218,1);
  auVar21 = vblendvps_avx(auVar70,auVar218,auVar21);
  auVar100 = vfmadd231ps_fma(auVar18,auVar312,auVar19);
  auVar17 = vrcpps_avx(auVar16);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar219);
  auVar281 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16 = vrcpps_avx(auVar159);
  auVar159 = vfnmadd213ps_fma(auVar159,auVar16,auVar219);
  auVar70 = vfmadd132ps_fma(auVar159,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar21);
  auVar21 = vfnmadd213ps_fma(auVar21,auVar16,auVar219);
  auVar69 = vfmadd132ps_fma(auVar21,auVar16,auVar16);
  fVar67 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar61 + 0x16)) *
           *(float *)(prim + lVar61 + 0x1a);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar202._4_4_ = fVar67;
  auVar202._0_4_ = fVar67;
  auVar202._8_4_ = fVar67;
  auVar202._12_4_ = fVar67;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar59 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar21);
  auVar156 = vfmadd213ps_fma(auVar16,auVar202,auVar21);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar21 = vpmovsxwd_avx(auVar159);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar59 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar21);
  auVar159 = vfmadd213ps_fma(auVar16,auVar202,auVar21);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar59 * 0x12 + 6);
  auVar21 = vpmovsxwd_avx(auVar18);
  uVar60 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar59 * 2 + uVar60 + 6);
  auVar16 = vpmovsxwd_avx(auVar188);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar21);
  auVar17 = vfmadd213ps_fma(auVar16,auVar202,auVar21);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar59 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar187);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar21);
  auVar18 = vfmadd213ps_fma(auVar16,auVar202,auVar21);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar59 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar20);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + uVar59 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar290);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar21);
  auVar188 = vfmadd213ps_fma(auVar16,auVar202,auVar21);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar59) + 6);
  auVar21 = vpmovsxwd_avx(auVar167);
  auVar21 = vcvtdq2ps_avx(auVar21);
  local_2f0 = prim;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar59 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar189);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar21);
  auVar16 = vfmadd213ps_fma(auVar16,auVar202,auVar21);
  auVar21 = vsubps_avx(auVar156,auVar98);
  auVar203._0_4_ = auVar281._0_4_ * auVar21._0_4_;
  auVar203._4_4_ = auVar281._4_4_ * auVar21._4_4_;
  auVar203._8_4_ = auVar281._8_4_ * auVar21._8_4_;
  auVar203._12_4_ = auVar281._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar159,auVar98);
  auVar127._0_4_ = auVar281._0_4_ * auVar21._0_4_;
  auVar127._4_4_ = auVar281._4_4_ * auVar21._4_4_;
  auVar127._8_4_ = auVar281._8_4_ * auVar21._8_4_;
  auVar127._12_4_ = auVar281._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar17,auVar99);
  auVar184._0_4_ = auVar70._0_4_ * auVar21._0_4_;
  auVar184._4_4_ = auVar70._4_4_ * auVar21._4_4_;
  auVar184._8_4_ = auVar70._8_4_ * auVar21._8_4_;
  auVar184._12_4_ = auVar70._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar18,auVar99);
  auVar99._0_4_ = auVar70._0_4_ * auVar21._0_4_;
  auVar99._4_4_ = auVar70._4_4_ * auVar21._4_4_;
  auVar99._8_4_ = auVar70._8_4_ * auVar21._8_4_;
  auVar99._12_4_ = auVar70._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar188,auVar100);
  auVar166._0_4_ = auVar69._0_4_ * auVar21._0_4_;
  auVar166._4_4_ = auVar69._4_4_ * auVar21._4_4_;
  auVar166._8_4_ = auVar69._8_4_ * auVar21._8_4_;
  auVar166._12_4_ = auVar69._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar16,auVar100);
  auVar281._0_4_ = auVar69._0_4_ * auVar21._0_4_;
  auVar281._4_4_ = auVar69._4_4_ * auVar21._4_4_;
  auVar281._8_4_ = auVar69._8_4_ * auVar21._8_4_;
  auVar281._12_4_ = auVar69._12_4_ * auVar21._12_4_;
  auVar21 = vpminsd_avx(auVar203,auVar127);
  auVar16 = vpminsd_avx(auVar184,auVar99);
  auVar21 = vmaxps_avx(auVar21,auVar16);
  auVar16 = vpminsd_avx(auVar166,auVar281);
  uVar68 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar240._4_4_ = uVar68;
  auVar240._0_4_ = uVar68;
  auVar240._8_4_ = uVar68;
  auVar240._12_4_ = uVar68;
  auVar16 = vmaxps_avx(auVar16,auVar240);
  auVar21 = vmaxps_avx(auVar21,auVar16);
  local_268._0_4_ = auVar21._0_4_ * 0.99999964;
  local_268._4_4_ = auVar21._4_4_ * 0.99999964;
  local_268._8_4_ = auVar21._8_4_ * 0.99999964;
  local_268._12_4_ = auVar21._12_4_ * 0.99999964;
  auVar21 = vpmaxsd_avx(auVar203,auVar127);
  auVar16 = vpmaxsd_avx(auVar184,auVar99);
  auVar21 = vminps_avx(auVar21,auVar16);
  auVar16 = vpmaxsd_avx(auVar166,auVar281);
  fVar67 = (ray->super_RayK<1>).tfar;
  auVar128._4_4_ = fVar67;
  auVar128._0_4_ = fVar67;
  auVar128._8_4_ = fVar67;
  auVar128._12_4_ = fVar67;
  auVar16 = vminps_avx(auVar16,auVar128);
  auVar21 = vminps_avx(auVar21,auVar16);
  auVar70._0_4_ = auVar21._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar21._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar21._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar21._12_4_ * 1.0000004;
  auVar100._1_3_ = 0;
  auVar100[0] = PVar7;
  auVar100[4] = PVar7;
  auVar100._5_3_ = 0;
  auVar100[8] = PVar7;
  auVar100._9_3_ = 0;
  auVar100[0xc] = PVar7;
  auVar100._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar100,_DAT_01f7fcf0);
  auVar21 = vcmpps_avx(local_268,auVar70,2);
  auVar21 = vandps_avx(auVar21,auVar16);
  uVar57 = vmovmskps_avx(auVar21);
  if (uVar57 == 0) {
    return;
  }
  uVar57 = uVar57 & 0xff;
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  local_338 = 0x80000000;
  uStack_334 = 0x80000000;
  uStack_330 = 0x80000000;
  uStack_32c = 0x80000000;
  do {
    lVar61 = 0;
    for (uVar59 = (ulong)uVar57; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      lVar61 = lVar61 + 1;
    }
    uVar58 = *(uint *)(local_2f0 + 2);
    pGVar8 = (context->scene->geometries).items[uVar58].ptr;
    fVar67 = (pGVar8->time_range).lower;
    fVar148 = pGVar8->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar67) /
              ((pGVar8->time_range).upper - fVar67));
    auVar21 = vroundss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),9);
    auVar21 = vminss_avx(auVar21,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar290 = vmaxss_avx(ZEXT816(0),auVar21);
    local_420 = (ulong)*(uint *)(local_2f0 + lVar61 * 4 + 6);
    uVar59 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)*(uint *)(local_2f0 + lVar61 * 4 + 6) *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar66 = (long)(int)auVar290._0_4_ * 0x38;
    lVar10 = *(long *)(_Var9 + lVar66);
    lVar11 = *(long *)(_Var9 + 0x10 + lVar66);
    auVar21 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar59);
    lVar61 = uVar59 + 1;
    auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar61);
    lVar1 = uVar59 + 2;
    auVar159 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
    lVar2 = uVar59 + 3;
    pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
    auVar55 = *pauVar3;
    fVar67 = *(float *)pauVar3[1];
    lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
    lVar11 = *(long *)(lVar10 + lVar66);
    lVar12 = *(long *)(lVar10 + 0x10 + lVar66);
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar59);
    auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar61);
    auVar188 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
    fVar94 = *pfVar4;
    fVar147 = pfVar4[1];
    fVar95 = pfVar4[2];
    fVar146 = pfVar4[3];
    auVar277._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar277._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar277._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar277._12_4_ = fVar67 * 0.0;
    auVar298._8_4_ = 0x3e2aaaab;
    auVar298._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar298._12_4_ = 0x3e2aaaab;
    auVar281 = vfmadd213ps_fma(auVar298,auVar159,auVar277);
    auVar319._8_4_ = 0x3f000000;
    auVar319._0_8_ = 0x3f0000003f000000;
    auVar319._12_4_ = 0x3f000000;
    auVar19 = vfmadd231ps_fma(auVar277,auVar159,auVar319);
    auVar167 = ZEXT816(0) << 0x20;
    auVar19 = vfnmadd231ps_fma(auVar19,auVar16,auVar167);
    auVar127 = vfnmadd231ps_fma(auVar19,auVar21,auVar319);
    auVar185._0_4_ = fVar94 * 0.0;
    auVar185._4_4_ = fVar147 * 0.0;
    auVar185._8_4_ = fVar95 * 0.0;
    auVar185._12_4_ = fVar146 * 0.0;
    auVar19 = vfmadd213ps_fma(auVar298,auVar188,auVar185);
    auVar149._8_4_ = 0x3f2aaaab;
    auVar149._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar149._12_4_ = 0x3f2aaaab;
    auVar19 = vfmadd231ps_fma(auVar19,auVar18,auVar149);
    auVar19 = vfmadd231ps_fma(auVar19,auVar17,auVar298);
    auVar187 = vfmadd231ps_fma(auVar185,auVar188,auVar319);
    auVar187 = vfnmadd231ps_fma(auVar187,auVar18,auVar167);
    auVar20 = vfnmadd231ps_fma(auVar187,auVar17,auVar319);
    auVar299._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar299._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar299._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar299._12_4_ = fVar67 * 0.5;
    auVar187 = vfmadd231ps_fma(auVar299,auVar167,auVar159);
    auVar187 = vfnmadd231ps_fma(auVar187,auVar319,auVar16);
    auVar128 = vfnmadd231ps_fma(auVar187,auVar167,auVar21);
    auVar241._0_4_ = fVar94 * 0.16666667;
    auVar241._4_4_ = fVar147 * 0.16666667;
    auVar241._8_4_ = fVar95 * 0.16666667;
    auVar241._12_4_ = fVar146 * 0.16666667;
    auVar187 = vfmadd231ps_fma(auVar241,auVar188,auVar149);
    auVar187 = vfmadd231ps_fma(auVar187,auVar18,auVar298);
    auVar187 = vfmadd231ps_fma(auVar187,auVar17,auVar167);
    auVar204._0_4_ = fVar94 * 0.5;
    auVar204._4_4_ = fVar147 * 0.5;
    auVar204._8_4_ = fVar95 * 0.5;
    auVar204._12_4_ = fVar146 * 0.5;
    auVar188 = vfmadd231ps_fma(auVar204,auVar167,auVar188);
    auVar18 = vfnmadd231ps_fma(auVar188,auVar319,auVar18);
    auVar188 = vfnmadd231ps_fma(auVar18,auVar167,auVar17);
    auVar17 = vshufps_avx(auVar127,auVar127,0xc9);
    auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
    fVar276 = auVar127._0_4_;
    auVar101._0_4_ = fVar276 * auVar18._0_4_;
    fVar286 = auVar127._4_4_;
    auVar101._4_4_ = fVar286 * auVar18._4_4_;
    fVar287 = auVar127._8_4_;
    auVar101._8_4_ = fVar287 * auVar18._8_4_;
    fVar288 = auVar127._12_4_;
    auVar101._12_4_ = fVar288 * auVar18._12_4_;
    auVar69 = vfmsub231ps_fma(auVar101,auVar17,auVar19);
    auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
    auVar102._0_4_ = fVar276 * auVar18._0_4_;
    auVar102._4_4_ = fVar286 * auVar18._4_4_;
    auVar102._8_4_ = fVar287 * auVar18._8_4_;
    auVar102._12_4_ = fVar288 * auVar18._12_4_;
    auVar156 = vfmsub231ps_fma(auVar102,auVar17,auVar20);
    auVar17 = vshufps_avx(auVar128,auVar128,0xc9);
    auVar18 = vshufps_avx(auVar187,auVar187,0xc9);
    fVar297 = auVar128._0_4_;
    auVar103._0_4_ = fVar297 * auVar18._0_4_;
    fVar308 = auVar128._4_4_;
    auVar103._4_4_ = fVar308 * auVar18._4_4_;
    fVar309 = auVar128._8_4_;
    auVar103._8_4_ = fVar309 * auVar18._8_4_;
    fVar310 = auVar128._12_4_;
    auVar103._12_4_ = fVar310 * auVar18._12_4_;
    auVar98 = vfmsub231ps_fma(auVar103,auVar17,auVar187);
    auVar18 = vshufps_avx(auVar188,auVar188,0xc9);
    auVar104._0_4_ = fVar297 * auVar18._0_4_;
    auVar104._4_4_ = fVar308 * auVar18._4_4_;
    auVar104._8_4_ = fVar309 * auVar18._8_4_;
    auVar104._12_4_ = fVar310 * auVar18._12_4_;
    auVar99 = vfmsub231ps_fma(auVar104,auVar17,auVar188);
    lVar11 = *(long *)(_Var9 + 0x38 + lVar66);
    lVar12 = *(long *)(_Var9 + 0x48 + lVar66);
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
    auVar56 = *pauVar3;
    fVar146 = *(float *)pauVar3[1];
    lVar13 = *(long *)(lVar10 + 0x38 + lVar66);
    lVar10 = *(long *)(lVar10 + 0x48 + lVar66);
    auVar253._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar253._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar253._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar253._12_4_ = fVar146 * 0.0;
    auVar70 = vfmadd213ps_fma(auVar298,auVar17,auVar253);
    auVar188 = vfmadd231ps_fma(auVar253,auVar17,auVar319);
    auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar61);
    auVar19 = vfnmadd231ps_fma(auVar188,auVar18,ZEXT816(0) << 0x20);
    auVar188 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar59);
    auVar166 = vfnmadd231ps_fma(auVar19,auVar188,auVar319);
    auVar19 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
    pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
    fVar94 = *pfVar4;
    fVar147 = pfVar4[1];
    fVar95 = pfVar4[2];
    fVar125 = pfVar4[3];
    auVar71._0_4_ = fVar94 * 0.0;
    auVar71._4_4_ = fVar147 * 0.0;
    auVar71._8_4_ = fVar95 * 0.0;
    auVar71._12_4_ = fVar125 * 0.0;
    auVar20 = vfmadd213ps_fma(auVar298,auVar19,auVar71);
    auVar187 = *(undefined1 (*) [16])(lVar13 + lVar61 * lVar10);
    auVar105._8_4_ = 0x3f2aaaab;
    auVar105._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar105._12_4_ = 0x3f2aaaab;
    auVar167 = vfmadd231ps_fma(auVar20,auVar187,auVar105);
    auVar20 = *(undefined1 (*) [16])(lVar13 + uVar59 * lVar10);
    auVar189 = vfmadd231ps_fma(auVar167,auVar20,auVar298);
    auVar167 = vshufps_avx(auVar189,auVar189,0xc9);
    fVar251 = auVar166._0_4_;
    auVar220._0_4_ = fVar251 * auVar167._0_4_;
    fVar96 = auVar166._4_4_;
    auVar220._4_4_ = fVar96 * auVar167._4_4_;
    fVar264 = auVar166._8_4_;
    auVar220._8_4_ = fVar264 * auVar167._8_4_;
    fVar265 = auVar166._12_4_;
    auVar220._12_4_ = fVar265 * auVar167._12_4_;
    auVar167 = vshufps_avx(auVar166,auVar166,0xc9);
    auVar100 = vfmsub231ps_fma(auVar220,auVar167,auVar189);
    auVar189 = vfmadd231ps_fma(auVar71,auVar19,auVar319);
    auVar189 = vfnmadd231ps_fma(auVar189,auVar187,_DAT_01f7aa10);
    auVar106 = vfnmadd231ps_fma(auVar189,auVar20,auVar319);
    auVar189 = vshufps_avx(auVar106,auVar106,0xc9);
    auVar186._0_4_ = fVar251 * auVar189._0_4_;
    auVar186._4_4_ = fVar96 * auVar189._4_4_;
    auVar186._8_4_ = fVar264 * auVar189._8_4_;
    auVar186._12_4_ = fVar265 * auVar189._12_4_;
    auVar189 = vfmsub231ps_fma(auVar186,auVar167,auVar106);
    auVar72._0_4_ = fVar94 * 0.16666667;
    auVar72._4_4_ = fVar147 * 0.16666667;
    auVar72._8_4_ = fVar95 * 0.16666667;
    auVar72._12_4_ = fVar125 * 0.16666667;
    auVar221._8_4_ = 0x3f2aaaab;
    auVar221._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar221._12_4_ = 0x3f2aaaab;
    auVar167 = vfmadd231ps_fma(auVar72,auVar19,auVar221);
    auVar150._0_4_ = fVar94 * 0.5;
    auVar150._4_4_ = fVar147 * 0.5;
    auVar150._8_4_ = fVar95 * 0.5;
    auVar150._12_4_ = fVar125 * 0.5;
    auVar106 = ZEXT816(0) << 0x20;
    auVar19 = vfmadd231ps_fma(auVar150,auVar106,auVar19);
    auVar167 = vfmadd231ps_fma(auVar167,auVar187,auVar298);
    auVar19 = vfnmadd231ps_fma(auVar19,auVar319,auVar187);
    auVar187 = vfmadd231ps_fma(auVar167,auVar20,auVar106);
    auVar20 = vfnmadd231ps_fma(auVar19,auVar106,auVar20);
    local_528 = auVar56._0_4_;
    fStack_524 = auVar56._4_4_;
    fStack_520 = auVar56._8_4_;
    auVar242._0_4_ = local_528 * 0.5;
    auVar242._4_4_ = fStack_524 * 0.5;
    auVar242._8_4_ = fStack_520 * 0.5;
    auVar242._12_4_ = fVar146 * 0.5;
    auVar19 = vfmadd231ps_fma(auVar242,auVar106,auVar17);
    auVar19 = vfnmadd231ps_fma(auVar19,auVar319,auVar18);
    auVar184 = vfnmadd231ps_fma(auVar19,auVar106,auVar188);
    auVar19 = vshufps_avx(auVar187,auVar187,0xc9);
    fVar236 = auVar184._0_4_;
    auVar107._0_4_ = fVar236 * auVar19._0_4_;
    fVar237 = auVar184._4_4_;
    auVar107._4_4_ = fVar237 * auVar19._4_4_;
    fVar238 = auVar184._8_4_;
    auVar107._8_4_ = fVar238 * auVar19._8_4_;
    fVar250 = auVar184._12_4_;
    auVar107._12_4_ = fVar250 * auVar19._12_4_;
    auVar19 = vshufps_avx(auVar184,auVar184,0xc9);
    auVar106 = vfmsub231ps_fma(auVar107,auVar19,auVar187);
    auVar187 = vshufps_avx(auVar20,auVar20,0xc9);
    auVar73._0_4_ = fVar236 * auVar187._0_4_;
    auVar73._4_4_ = fVar237 * auVar187._4_4_;
    auVar73._8_4_ = fVar238 * auVar187._8_4_;
    auVar73._12_4_ = fVar250 * auVar187._12_4_;
    auVar126 = vfmsub231ps_fma(auVar73,auVar19,auVar20);
    fVar148 = fVar148 - auVar290._0_4_;
    local_548._0_4_ = auVar55._0_4_;
    local_548._4_4_ = auVar55._4_4_;
    fStack_540 = auVar55._8_4_;
    auVar108._0_4_ = (float)local_548._0_4_ * 0.16666667;
    auVar108._4_4_ = (float)local_548._4_4_ * 0.16666667;
    auVar108._8_4_ = fStack_540 * 0.16666667;
    auVar108._12_4_ = fVar67 * 0.16666667;
    auVar159 = vfmadd231ps_fma(auVar108,auVar221,auVar159);
    auVar19 = vfmadd231ps_fma(auVar281,auVar16,auVar221);
    auVar187 = vfmadd231ps_fma(auVar159,auVar16,auVar298);
    auVar159 = vpermilps_avx(auVar69,0xc9);
    auVar16 = vdpps_avx(auVar159,auVar159,0x7f);
    auVar20 = vfmadd231ps_fma(auVar19,auVar21,auVar298);
    auVar290 = vfmadd231ps_fma(auVar187,auVar21,ZEXT816(0));
    auVar19 = vpermilps_avx(auVar156,0xc9);
    fVar94 = auVar16._0_4_;
    auVar187 = ZEXT416((uint)fVar94);
    auVar21 = vrsqrtss_avx(auVar187,auVar187);
    fVar67 = auVar21._0_4_;
    auVar21 = vdpps_avx(auVar159,auVar19,0x7f);
    fVar67 = fVar67 * 1.5 + fVar94 * -0.5 * fVar67 * fVar67 * fVar67;
    auVar168._0_4_ = fVar94 * auVar19._0_4_;
    auVar168._4_4_ = fVar94 * auVar19._4_4_;
    auVar168._8_4_ = fVar94 * auVar19._8_4_;
    auVar168._12_4_ = fVar94 * auVar19._12_4_;
    fVar94 = auVar21._0_4_;
    auVar205._0_4_ = fVar94 * auVar159._0_4_;
    auVar205._4_4_ = fVar94 * auVar159._4_4_;
    auVar205._8_4_ = fVar94 * auVar159._8_4_;
    auVar205._12_4_ = fVar94 * auVar159._12_4_;
    auVar19 = vsubps_avx(auVar168,auVar205);
    auVar21 = vrcpss_avx(auVar187,auVar187);
    auVar16 = vfnmadd213ss_fma(auVar16,auVar21,SUB6416(ZEXT464(0x40000000),0));
    fVar147 = auVar21._0_4_ * auVar16._0_4_;
    auVar187 = vpermilps_avx(auVar98,0xc9);
    fVar125 = auVar159._0_4_ * fVar67;
    fVar143 = auVar159._4_4_ * fVar67;
    fVar144 = auVar159._8_4_ * fVar67;
    fVar145 = auVar159._12_4_ * fVar67;
    auVar16 = vdpps_avx(auVar187,auVar187,0x7f);
    auVar21 = vblendps_avx(auVar16,_DAT_01f7aa10,0xe);
    auVar159 = vrsqrtss_avx(auVar21,auVar21);
    fVar95 = auVar16._0_4_;
    fVar94 = auVar159._0_4_;
    fVar94 = fVar94 * 1.5 + fVar94 * fVar94 * fVar95 * -0.5 * fVar94;
    auVar159 = vpermilps_avx(auVar99,0xc9);
    auVar320._0_4_ = fVar95 * auVar159._0_4_;
    auVar320._4_4_ = fVar95 * auVar159._4_4_;
    auVar320._8_4_ = fVar95 * auVar159._8_4_;
    auVar320._12_4_ = fVar95 * auVar159._12_4_;
    auVar159 = vdpps_avx(auVar187,auVar159,0x7f);
    fVar95 = auVar159._0_4_;
    auVar222._0_4_ = fVar95 * auVar187._0_4_;
    auVar222._4_4_ = fVar95 * auVar187._4_4_;
    auVar222._8_4_ = fVar95 * auVar187._8_4_;
    auVar222._12_4_ = fVar95 * auVar187._12_4_;
    auVar159 = vsubps_avx(auVar320,auVar222);
    auVar21 = vrcpss_avx(auVar21,auVar21);
    auVar16 = vfnmadd213ss_fma(auVar16,auVar21,ZEXT416(0x40000000));
    fVar95 = auVar21._0_4_ * auVar16._0_4_;
    fVar165 = auVar187._0_4_ * fVar94;
    fVar181 = auVar187._4_4_ * fVar94;
    fVar182 = auVar187._8_4_ * fVar94;
    fVar183 = auVar187._12_4_ * fVar94;
    auVar21 = vshufps_avx(auVar127,auVar127,0xff);
    auVar16 = vshufps_avx(auVar20,auVar20,0xff);
    auVar223._0_4_ = auVar16._0_4_ * fVar125;
    auVar223._4_4_ = auVar16._4_4_ * fVar143;
    auVar223._8_4_ = auVar16._8_4_ * fVar144;
    auVar223._12_4_ = auVar16._12_4_ * fVar145;
    auVar74._0_4_ = auVar21._0_4_ * fVar125 + auVar16._0_4_ * fVar67 * fVar147 * auVar19._0_4_;
    auVar74._4_4_ = auVar21._4_4_ * fVar143 + auVar16._4_4_ * fVar67 * fVar147 * auVar19._4_4_;
    auVar74._8_4_ = auVar21._8_4_ * fVar144 + auVar16._8_4_ * fVar67 * fVar147 * auVar19._8_4_;
    auVar74._12_4_ = auVar21._12_4_ * fVar145 + auVar16._12_4_ * fVar67 * fVar147 * auVar19._12_4_;
    auVar19 = vsubps_avx(auVar20,auVar223);
    local_538._0_4_ = auVar20._0_4_ + auVar223._0_4_;
    local_538._4_4_ = auVar20._4_4_ + auVar223._4_4_;
    fStack_530 = auVar20._8_4_ + auVar223._8_4_;
    fStack_52c = auVar20._12_4_ + auVar223._12_4_;
    auVar187 = vsubps_avx(auVar127,auVar74);
    auVar21 = vshufps_avx(auVar128,auVar128,0xff);
    auVar16 = vshufps_avx(auVar290,auVar290,0xff);
    auVar169._0_4_ = auVar16._0_4_ * fVar165;
    auVar169._4_4_ = auVar16._4_4_ * fVar181;
    auVar169._8_4_ = auVar16._8_4_ * fVar182;
    auVar169._12_4_ = auVar16._12_4_ * fVar183;
    auVar151._0_4_ = auVar21._0_4_ * fVar165 + auVar16._0_4_ * fVar94 * auVar159._0_4_ * fVar95;
    auVar151._4_4_ = auVar21._4_4_ * fVar181 + auVar16._4_4_ * fVar94 * auVar159._4_4_ * fVar95;
    auVar151._8_4_ = auVar21._8_4_ * fVar182 + auVar16._8_4_ * fVar94 * auVar159._8_4_ * fVar95;
    auVar151._12_4_ = auVar21._12_4_ * fVar183 + auVar16._12_4_ * fVar94 * auVar159._12_4_ * fVar95;
    auVar159 = vsubps_avx(auVar290,auVar169);
    local_548._4_4_ = auVar290._4_4_ + auVar169._4_4_;
    local_548._0_4_ = auVar290._0_4_ + auVar169._0_4_;
    fStack_540 = auVar290._8_4_ + auVar169._8_4_;
    fStack_53c = auVar290._12_4_ + auVar169._12_4_;
    auVar20 = vsubps_avx(auVar128,auVar151);
    auVar75._8_4_ = 0x3e2aaaab;
    auVar75._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar75._12_4_ = 0x3e2aaaab;
    auVar300._0_4_ = local_528 * 0.16666667;
    auVar300._4_4_ = fStack_524 * 0.16666667;
    auVar300._8_4_ = fStack_520 * 0.16666667;
    auVar300._12_4_ = fVar146 * 0.16666667;
    auVar129._8_4_ = 0x3f2aaaab;
    auVar129._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar129._12_4_ = 0x3f2aaaab;
    auVar21 = vfmadd231ps_fma(auVar300,auVar129,auVar17);
    auVar16 = vfmadd231ps_fma(auVar70,auVar18,auVar129);
    auVar17 = vfmadd231ps_fma(auVar21,auVar18,auVar75);
    auVar18 = vpermilps_avx(auVar100,0xc9);
    auVar21 = vdpps_avx(auVar18,auVar18,0x7f);
    auVar290 = vfmadd231ps_fma(auVar16,auVar188,auVar75);
    auVar51._12_4_ = 0;
    auVar51._0_12_ = ZEXT812(0);
    auVar167 = vfmadd231ps_fma(auVar17,auVar188,auVar51 << 0x20);
    auVar17 = vpermilps_avx(auVar189,0xc9);
    fVar94 = auVar21._0_4_;
    auVar188 = ZEXT416((uint)fVar94);
    auVar16 = vrsqrtss_avx(auVar188,auVar188);
    fVar67 = auVar16._0_4_;
    auVar16 = vdpps_avx(auVar18,auVar17,0x7f);
    fVar67 = fVar67 * 1.5 + fVar67 * fVar67 * fVar94 * -0.5 * fVar67;
    auVar170._0_4_ = fVar94 * auVar17._0_4_;
    auVar170._4_4_ = fVar94 * auVar17._4_4_;
    auVar170._8_4_ = fVar94 * auVar17._8_4_;
    auVar170._12_4_ = fVar94 * auVar17._12_4_;
    fVar94 = auVar16._0_4_;
    auVar224._0_4_ = fVar94 * auVar18._0_4_;
    auVar224._4_4_ = fVar94 * auVar18._4_4_;
    auVar224._8_4_ = fVar94 * auVar18._8_4_;
    auVar224._12_4_ = fVar94 * auVar18._12_4_;
    auVar17 = vsubps_avx(auVar170,auVar224);
    auVar16 = vrcpss_avx(auVar188,auVar188);
    auVar21 = vfnmadd213ss_fma(auVar21,auVar16,SUB6416(ZEXT464(0x40000000),0));
    fVar147 = auVar16._0_4_ * auVar21._0_4_;
    auVar188 = vpermilps_avx(auVar106,0xc9);
    fVar146 = auVar18._0_4_ * fVar67;
    fVar125 = auVar18._4_4_ * fVar67;
    fVar143 = auVar18._8_4_ * fVar67;
    fVar144 = auVar18._12_4_ * fVar67;
    auVar21 = vdpps_avx(auVar188,auVar188,0x7f);
    fVar95 = auVar21._0_4_;
    auVar189 = ZEXT416((uint)fVar95);
    auVar16 = vrsqrtss_avx(auVar189,auVar189);
    fVar94 = auVar16._0_4_;
    fVar94 = fVar95 * -0.5 * fVar94 * fVar94 * fVar94 + fVar94 * 1.5;
    auVar16 = vpermilps_avx(auVar126,0xc9);
    auVar313._0_4_ = fVar95 * auVar16._0_4_;
    auVar313._4_4_ = fVar95 * auVar16._4_4_;
    auVar313._8_4_ = fVar95 * auVar16._8_4_;
    auVar313._12_4_ = fVar95 * auVar16._12_4_;
    auVar16 = vdpps_avx(auVar188,auVar16,0x7f);
    fVar95 = auVar16._0_4_;
    auVar278._0_4_ = fVar95 * auVar188._0_4_;
    auVar278._4_4_ = fVar95 * auVar188._4_4_;
    auVar278._8_4_ = fVar95 * auVar188._8_4_;
    auVar278._12_4_ = fVar95 * auVar188._12_4_;
    auVar18 = vsubps_avx(auVar313,auVar278);
    auVar16 = vrcpss_avx(auVar189,auVar189);
    auVar21 = vfnmadd213ss_fma(auVar21,auVar16,SUB6416(ZEXT464(0x40000000),0));
    fVar95 = auVar16._0_4_ * auVar21._0_4_;
    fVar145 = auVar188._0_4_ * fVar94;
    fVar165 = auVar188._4_4_ * fVar94;
    fVar181 = auVar188._8_4_ * fVar94;
    fVar182 = auVar188._12_4_ * fVar94;
    auVar21 = vshufps_avx(auVar166,auVar166,0xff);
    auVar16 = vshufps_avx(auVar290,auVar290,0xff);
    auVar152._0_4_ = auVar16._0_4_ * fVar146;
    auVar152._4_4_ = auVar16._4_4_ * fVar125;
    auVar152._8_4_ = auVar16._8_4_ * fVar143;
    auVar152._12_4_ = auVar16._12_4_ * fVar144;
    auVar109._0_4_ = auVar21._0_4_ * fVar146 + auVar16._0_4_ * fVar67 * fVar147 * auVar17._0_4_;
    auVar109._4_4_ = auVar21._4_4_ * fVar125 + auVar16._4_4_ * fVar67 * fVar147 * auVar17._4_4_;
    auVar109._8_4_ = auVar21._8_4_ * fVar143 + auVar16._8_4_ * fVar67 * fVar147 * auVar17._8_4_;
    auVar109._12_4_ = auVar21._12_4_ * fVar144 + auVar16._12_4_ * fVar67 * fVar147 * auVar17._12_4_;
    auVar17 = vsubps_avx(auVar290,auVar152);
    fVar147 = auVar290._0_4_ + auVar152._0_4_;
    fVar146 = auVar290._4_4_ + auVar152._4_4_;
    fVar125 = auVar290._8_4_ + auVar152._8_4_;
    fVar143 = auVar290._12_4_ + auVar152._12_4_;
    auVar188 = vsubps_avx(auVar166,auVar109);
    auVar21 = vshufps_avx(auVar184,auVar184,0xff);
    auVar16 = vshufps_avx(auVar167,auVar167,0xff);
    auVar171._0_4_ = auVar16._0_4_ * fVar145;
    auVar171._4_4_ = auVar16._4_4_ * fVar165;
    auVar171._8_4_ = auVar16._8_4_ * fVar181;
    auVar171._12_4_ = auVar16._12_4_ * fVar182;
    auVar110._0_4_ = auVar21._0_4_ * fVar145 + auVar16._0_4_ * fVar94 * auVar18._0_4_ * fVar95;
    auVar110._4_4_ = auVar21._4_4_ * fVar165 + auVar16._4_4_ * fVar94 * auVar18._4_4_ * fVar95;
    auVar110._8_4_ = auVar21._8_4_ * fVar181 + auVar16._8_4_ * fVar94 * auVar18._8_4_ * fVar95;
    auVar110._12_4_ = auVar21._12_4_ * fVar182 + auVar16._12_4_ * fVar94 * auVar18._12_4_ * fVar95;
    auVar21 = vsubps_avx(auVar167,auVar171);
    auVar172._0_4_ = auVar167._0_4_ + auVar171._0_4_;
    auVar172._4_4_ = auVar167._4_4_ + auVar171._4_4_;
    auVar172._8_4_ = auVar167._8_4_ + auVar171._8_4_;
    auVar172._12_4_ = auVar167._12_4_ + auVar171._12_4_;
    auVar16 = vsubps_avx(auVar184,auVar110);
    local_3f8._0_4_ = auVar187._0_4_;
    local_3f8._4_4_ = auVar187._4_4_;
    uStack_3f0._0_4_ = auVar187._8_4_;
    uStack_3f0._4_4_ = auVar187._12_4_;
    auVar301._0_4_ = auVar19._0_4_ + (float)local_3f8._0_4_ * 0.33333334;
    auVar301._4_4_ = auVar19._4_4_ + (float)local_3f8._4_4_ * 0.33333334;
    auVar301._8_4_ = auVar19._8_4_ + (float)uStack_3f0 * 0.33333334;
    auVar301._12_4_ = auVar19._12_4_ + uStack_3f0._4_4_ * 0.33333334;
    fVar67 = 1.0 - fVar148;
    auVar111._4_4_ = fVar67;
    auVar111._0_4_ = fVar67;
    auVar111._8_4_ = fVar67;
    auVar111._12_4_ = fVar67;
    auVar225._0_4_ = fVar148 * auVar17._0_4_;
    auVar225._4_4_ = fVar148 * auVar17._4_4_;
    auVar225._8_4_ = fVar148 * auVar17._8_4_;
    auVar225._12_4_ = fVar148 * auVar17._12_4_;
    local_348 = vfmadd231ps_fma(auVar225,auVar111,auVar19);
    auVar130._0_4_ = fVar148 * (auVar17._0_4_ + auVar188._0_4_ * 0.33333334);
    auVar130._4_4_ = fVar148 * (auVar17._4_4_ + auVar188._4_4_ * 0.33333334);
    auVar130._8_4_ = fVar148 * (auVar17._8_4_ + auVar188._8_4_ * 0.33333334);
    auVar130._12_4_ = fVar148 * (auVar17._12_4_ + auVar188._12_4_ * 0.33333334);
    local_358 = vfmadd231ps_fma(auVar130,auVar111,auVar301);
    local_4b8._0_4_ = auVar20._0_4_;
    local_4b8._4_4_ = auVar20._4_4_;
    fStack_4b0 = auVar20._8_4_;
    fStack_4ac = auVar20._12_4_;
    auVar131._0_4_ = (float)local_4b8._0_4_ * 0.33333334;
    auVar131._4_4_ = (float)local_4b8._4_4_ * 0.33333334;
    auVar131._8_4_ = fStack_4b0 * 0.33333334;
    auVar131._12_4_ = fStack_4ac * 0.33333334;
    auVar17 = vsubps_avx(auVar159,auVar131);
    local_4a8._4_4_ = (float)local_538._4_4_ + (fVar286 + auVar74._4_4_) * 0.33333334;
    local_4a8._0_4_ = (float)local_538._0_4_ + (fVar276 + auVar74._0_4_) * 0.33333334;
    fStack_4a0 = fStack_530 + (fVar287 + auVar74._8_4_) * 0.33333334;
    fStack_49c = fStack_52c + (fVar288 + auVar74._12_4_) * 0.33333334;
    auVar267._0_4_ = (fVar297 + auVar151._0_4_) * 0.33333334;
    auVar267._4_4_ = (fVar308 + auVar151._4_4_) * 0.33333334;
    auVar267._8_4_ = (fVar309 + auVar151._8_4_) * 0.33333334;
    auVar267._12_4_ = (fVar310 + auVar151._12_4_) * 0.33333334;
    auVar18 = vsubps_avx(_local_548,auVar267);
    auVar279._0_4_ = auVar16._0_4_ * 0.33333334;
    auVar279._4_4_ = auVar16._4_4_ * 0.33333334;
    auVar279._8_4_ = auVar16._8_4_ * 0.33333334;
    auVar279._12_4_ = auVar16._12_4_ * 0.33333334;
    auVar16 = vsubps_avx(auVar21,auVar279);
    auVar243._0_4_ = (fVar236 + auVar110._0_4_) * 0.33333334;
    auVar243._4_4_ = (fVar237 + auVar110._4_4_) * 0.33333334;
    auVar243._8_4_ = (fVar238 + auVar110._8_4_) * 0.33333334;
    auVar243._12_4_ = (fVar250 + auVar110._12_4_) * 0.33333334;
    auVar188 = vsubps_avx(auVar172,auVar243);
    auVar280._0_4_ = fVar148 * auVar16._0_4_;
    auVar280._4_4_ = fVar148 * auVar16._4_4_;
    auVar280._8_4_ = fVar148 * auVar16._8_4_;
    auVar280._12_4_ = fVar148 * auVar16._12_4_;
    auVar206._0_4_ = fVar148 * auVar21._0_4_;
    auVar206._4_4_ = fVar148 * auVar21._4_4_;
    auVar206._8_4_ = fVar148 * auVar21._8_4_;
    auVar206._12_4_ = fVar148 * auVar21._12_4_;
    local_368 = vfmadd231ps_fma(auVar280,auVar111,auVar17);
    local_378 = vfmadd231ps_fma(auVar206,auVar111,auVar159);
    auVar132._0_4_ = fVar148 * fVar147;
    auVar132._4_4_ = fVar148 * fVar146;
    auVar132._8_4_ = fVar148 * fVar125;
    auVar132._12_4_ = fVar148 * fVar143;
    auVar153._0_4_ = fVar148 * (fVar147 + (fVar251 + auVar109._0_4_) * 0.33333334);
    auVar153._4_4_ = fVar148 * (fVar146 + (fVar96 + auVar109._4_4_) * 0.33333334);
    auVar153._8_4_ = fVar148 * (fVar125 + (fVar264 + auVar109._8_4_) * 0.33333334);
    auVar153._12_4_ = fVar148 * (fVar143 + (fVar265 + auVar109._12_4_) * 0.33333334);
    auVar190._0_4_ = fVar148 * auVar188._0_4_;
    auVar190._4_4_ = fVar148 * auVar188._4_4_;
    auVar190._8_4_ = fVar148 * auVar188._8_4_;
    auVar190._12_4_ = fVar148 * auVar188._12_4_;
    auVar173._0_4_ = fVar148 * auVar172._0_4_;
    auVar173._4_4_ = fVar148 * auVar172._4_4_;
    auVar173._8_4_ = fVar148 * auVar172._8_4_;
    auVar173._12_4_ = fVar148 * auVar172._12_4_;
    _local_388 = vfmadd231ps_fma(auVar132,auVar111,_local_538);
    _local_398 = vfmadd231ps_fma(auVar153,auVar111,_local_4a8);
    _local_3c8 = vfmadd231ps_fma(auVar190,auVar111,auVar18);
    _local_3d8 = vfmadd231ps_fma(auVar173,auVar111,_local_548);
    aVar5 = (ray->super_RayK<1>).org.field_0;
    auVar159 = vsubps_avx(local_348,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar159,auVar159,0x55);
    auVar16 = vshufps_avx(auVar159,auVar159,0xaa);
    aVar6 = (pre->ray_space).vy.field_0;
    fVar67 = (pre->ray_space).vz.field_0.m128[0];
    fVar94 = (pre->ray_space).vz.field_0.m128[1];
    fVar148 = (pre->ray_space).vz.field_0.m128[2];
    fVar147 = (pre->ray_space).vz.field_0.m128[3];
    auVar174._0_4_ = fVar67 * auVar16._0_4_;
    auVar174._4_4_ = fVar94 * auVar16._4_4_;
    auVar174._8_4_ = fVar148 * auVar16._8_4_;
    auVar174._12_4_ = fVar147 * auVar16._12_4_;
    auVar290 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar6,auVar21);
    auVar17 = vsubps_avx(local_358,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar17,auVar17,0x55);
    auVar16 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar112._0_4_ = fVar67 * auVar16._0_4_;
    auVar112._4_4_ = fVar94 * auVar16._4_4_;
    auVar112._8_4_ = fVar148 * auVar16._8_4_;
    auVar112._12_4_ = fVar147 * auVar16._12_4_;
    auVar167 = vfmadd231ps_fma(auVar112,(undefined1  [16])aVar6,auVar21);
    auVar16 = vsubps_avx(local_368,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar133._0_4_ = fVar67 * auVar21._0_4_;
    auVar133._4_4_ = fVar94 * auVar21._4_4_;
    auVar133._8_4_ = fVar148 * auVar21._8_4_;
    auVar133._12_4_ = fVar147 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar16,auVar16,0x55);
    auVar189 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar6,auVar21);
    auVar18 = vsubps_avx(local_378,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar154._0_4_ = fVar67 * auVar21._0_4_;
    auVar154._4_4_ = fVar94 * auVar21._4_4_;
    auVar154._8_4_ = fVar148 * auVar21._8_4_;
    auVar154._12_4_ = fVar147 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar18,auVar18,0x55);
    auVar281 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar6,auVar21);
    auVar188 = vsubps_avx(_local_388,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar188,auVar188,0xaa);
    auVar191._0_4_ = fVar67 * auVar21._0_4_;
    auVar191._4_4_ = fVar94 * auVar21._4_4_;
    auVar191._8_4_ = fVar148 * auVar21._8_4_;
    auVar191._12_4_ = fVar147 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar188,auVar188,0x55);
    auVar70 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar21);
    auVar19 = vsubps_avx(_local_398,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar19,auVar19,0xaa);
    auVar254._0_4_ = fVar67 * auVar21._0_4_;
    auVar254._4_4_ = fVar94 * auVar21._4_4_;
    auVar254._8_4_ = fVar148 * auVar21._8_4_;
    auVar254._12_4_ = fVar147 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar19,auVar19,0x55);
    auVar69 = vfmadd231ps_fma(auVar254,(undefined1  [16])aVar6,auVar21);
    auVar187 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar187,auVar187,0xaa);
    auVar289._0_4_ = fVar67 * auVar21._0_4_;
    auVar289._4_4_ = fVar94 * auVar21._4_4_;
    auVar289._8_4_ = fVar148 * auVar21._8_4_;
    auVar289._12_4_ = fVar147 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar187,auVar187,0x55);
    auVar156 = vfmadd231ps_fma(auVar289,(undefined1  [16])aVar6,auVar21);
    auVar20 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
    auVar21 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar226._0_4_ = fVar67 * auVar21._0_4_;
    auVar226._4_4_ = fVar94 * auVar21._4_4_;
    auVar226._8_4_ = fVar148 * auVar21._8_4_;
    auVar226._12_4_ = fVar147 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar20,auVar20,0x55);
    auVar21 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar6,auVar21);
    local_538._0_4_ = auVar159._0_4_;
    auVar207._4_4_ = local_538._0_4_;
    auVar207._0_4_ = local_538._0_4_;
    auVar207._8_4_ = local_538._0_4_;
    auVar207._12_4_ = local_538._0_4_;
    aVar6 = (pre->ray_space).vx.field_0;
    auVar290 = vfmadd231ps_fma(auVar290,(undefined1  [16])aVar6,auVar207);
    local_528 = auVar17._0_4_;
    auVar208._4_4_ = local_528;
    auVar208._0_4_ = local_528;
    auVar208._8_4_ = local_528;
    auVar208._12_4_ = local_528;
    auVar167 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar6,auVar208);
    uVar68 = auVar16._0_4_;
    auVar209._4_4_ = uVar68;
    auVar209._0_4_ = uVar68;
    auVar209._8_4_ = uVar68;
    auVar209._12_4_ = uVar68;
    auVar189 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar6,auVar209);
    uVar68 = auVar18._0_4_;
    auVar210._4_4_ = uVar68;
    auVar210._0_4_ = uVar68;
    auVar210._8_4_ = uVar68;
    auVar210._12_4_ = uVar68;
    auVar281 = vfmadd231ps_fma(auVar281,(undefined1  [16])aVar6,auVar210);
    uVar68 = auVar188._0_4_;
    auVar211._4_4_ = uVar68;
    auVar211._0_4_ = uVar68;
    auVar211._8_4_ = uVar68;
    auVar211._12_4_ = uVar68;
    auVar188 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar6,auVar211);
    uVar68 = auVar19._0_4_;
    auVar212._4_4_ = uVar68;
    auVar212._0_4_ = uVar68;
    auVar212._8_4_ = uVar68;
    auVar212._12_4_ = uVar68;
    auVar19 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar6,auVar212);
    auVar76._0_4_ = auVar187._0_4_;
    auVar76._4_4_ = auVar76._0_4_;
    auVar76._8_4_ = auVar76._0_4_;
    auVar76._12_4_ = auVar76._0_4_;
    auVar187 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar6,auVar76);
    uVar68 = auVar20._0_4_;
    auVar77._4_4_ = uVar68;
    auVar77._0_4_ = uVar68;
    auVar77._8_4_ = uVar68;
    auVar77._12_4_ = uVar68;
    auVar20 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar77);
    _local_4b8 = vmovlhps_avx(auVar290,auVar188);
    auVar17 = vmovlhps_avx(auVar167,auVar19);
    auVar18 = vmovlhps_avx(auVar189,auVar187);
    _local_4a8 = vmovlhps_avx(auVar281,auVar20);
    auVar21 = vminps_avx(_local_4b8,auVar17);
    auVar16 = vminps_avx(auVar18,_local_4a8);
    auVar159 = vminps_avx(auVar21,auVar16);
    auVar21 = vmaxps_avx(_local_4b8,auVar17);
    auVar16 = vmaxps_avx(auVar18,_local_4a8);
    auVar21 = vmaxps_avx(auVar21,auVar16);
    auVar16 = vshufpd_avx(auVar159,auVar159,3);
    auVar159 = vminps_avx(auVar159,auVar16);
    auVar16 = vshufpd_avx(auVar21,auVar21,3);
    auVar16 = vmaxps_avx(auVar21,auVar16);
    auVar21 = vandps_avx(local_2b8,auVar159);
    auVar16 = vandps_avx(local_2b8,auVar16);
    auVar21 = vmaxps_avx(auVar21,auVar16);
    auVar16 = vmovshdup_avx(auVar21);
    auVar21 = vmaxss_avx(auVar16,auVar21);
    local_1d8 = auVar21._0_4_ * 9.536743e-07;
    auVar244._8_8_ = auVar290._0_8_;
    auVar244._0_8_ = auVar290._0_8_;
    local_468._0_8_ = auVar167._0_8_;
    local_468._8_8_ = local_468._0_8_;
    local_478._0_8_ = auVar189._0_8_;
    local_478._8_8_ = local_478._0_8_;
    local_488._0_8_ = auVar281._0_8_;
    local_488._8_8_ = local_488._0_8_;
    register0x00001308 = auVar188._0_8_;
    local_498 = auVar188._0_8_;
    register0x00001348 = auVar20._0_8_;
    local_328 = auVar20._0_8_;
    local_438 = ZEXT416((uint)local_1d8);
    fStack_1d4 = local_1d8;
    fStack_1d0 = local_1d8;
    fStack_1cc = local_1d8;
    fStack_1c8 = local_1d8;
    fStack_1c4 = local_1d8;
    fStack_1c0 = local_1d8;
    fStack_1bc = local_1d8;
    local_78 = (uint)local_1d8 ^ local_338;
    uStack_74 = local_78;
    uStack_70 = local_78;
    uStack_6c = local_78;
    uStack_68 = local_78;
    uStack_64 = local_78;
    uStack_60 = local_78;
    uStack_5c = local_78;
    uVar65 = 0;
    local_1e8 = vsubps_avx(auVar17,_local_4b8);
    local_1f8 = vsubps_avx(auVar18,auVar17);
    local_208 = vsubps_avx(_local_4a8,auVar18);
    local_228 = vsubps_avx(_local_388,local_348);
    local_238 = vsubps_avx(_local_398,local_358);
    local_248 = vsubps_avx(_local_3c8,local_368);
    _local_258 = vsubps_avx(_local_3d8,local_378);
    auVar78 = ZEXT816(0x3f80000000000000);
    local_218 = auVar78;
LAB_016d5c3a:
    auVar21 = vshufps_avx(auVar78,auVar78,0x50);
    auVar321._8_4_ = 0x3f800000;
    auVar321._0_8_ = 0x3f8000003f800000;
    auVar321._12_4_ = 0x3f800000;
    auVar324._16_4_ = 0x3f800000;
    auVar324._0_16_ = auVar321;
    auVar324._20_4_ = 0x3f800000;
    auVar324._24_4_ = 0x3f800000;
    auVar324._28_4_ = 0x3f800000;
    auVar16 = vsubps_avx(auVar321,auVar21);
    fVar67 = auVar21._0_4_;
    auVar79._0_4_ = local_498._0_4_ * fVar67;
    fVar94 = auVar21._4_4_;
    auVar79._4_4_ = local_498._4_4_ * fVar94;
    fVar148 = auVar21._8_4_;
    auVar79._8_4_ = local_498._8_4_ * fVar148;
    fVar147 = auVar21._12_4_;
    auVar79._12_4_ = local_498._12_4_ * fVar147;
    fVar144 = auVar19._0_4_;
    auVar213._0_4_ = fVar144 * fVar67;
    fVar165 = auVar19._4_4_;
    auVar213._4_4_ = fVar165 * fVar94;
    auVar213._8_4_ = fVar144 * fVar148;
    auVar213._12_4_ = fVar165 * fVar147;
    fVar250 = auVar187._0_4_;
    auVar175._0_4_ = fVar250 * fVar67;
    fVar251 = auVar187._4_4_;
    auVar175._4_4_ = fVar251 * fVar94;
    auVar175._8_4_ = fVar250 * fVar148;
    auVar175._12_4_ = fVar251 * fVar147;
    auVar134._0_4_ = local_328._0_4_ * fVar67;
    auVar134._4_4_ = local_328._4_4_ * fVar94;
    auVar134._8_4_ = local_328._8_4_ * fVar148;
    auVar134._12_4_ = local_328._12_4_ * fVar147;
    auVar20 = vfmadd231ps_fma(auVar79,auVar16,auVar244);
    auVar290 = vfmadd231ps_fma(auVar213,auVar16,local_468);
    auVar167 = vfmadd231ps_fma(auVar175,auVar16,local_478);
    auVar189 = vfmadd231ps_fma(auVar134,local_488,auVar16);
    auVar21 = vmovshdup_avx(local_218);
    fVar67 = local_218._0_4_;
    fStack_120 = (auVar21._0_4_ - fVar67) * 0.04761905;
    auVar262._4_4_ = fVar67;
    auVar262._0_4_ = fVar67;
    auVar262._8_4_ = fVar67;
    auVar262._12_4_ = fVar67;
    auVar262._16_4_ = fVar67;
    auVar262._20_4_ = fVar67;
    auVar262._24_4_ = fVar67;
    auVar262._28_4_ = fVar67;
    auVar122._0_8_ = auVar21._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar91 = vsubps_avx(auVar122,auVar262);
    uVar68 = auVar20._0_4_;
    auVar317._4_4_ = uVar68;
    auVar317._0_4_ = uVar68;
    auVar317._8_4_ = uVar68;
    auVar317._12_4_ = uVar68;
    auVar317._16_4_ = uVar68;
    auVar317._20_4_ = uVar68;
    auVar317._24_4_ = uVar68;
    auVar317._28_4_ = uVar68;
    auVar21 = vmovshdup_avx(auVar20);
    uVar97 = auVar21._0_8_;
    auVar307._8_8_ = uVar97;
    auVar307._0_8_ = uVar97;
    auVar307._16_8_ = uVar97;
    auVar307._24_8_ = uVar97;
    fVar145 = auVar290._0_4_;
    auVar294._4_4_ = fVar145;
    auVar294._0_4_ = fVar145;
    auVar294._8_4_ = fVar145;
    auVar294._12_4_ = fVar145;
    auVar294._16_4_ = fVar145;
    auVar294._20_4_ = fVar145;
    auVar294._24_4_ = fVar145;
    auVar294._28_4_ = fVar145;
    auVar16 = vmovshdup_avx(auVar290);
    auVar123._0_8_ = auVar16._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar123._16_8_ = auVar123._0_8_;
    auVar123._24_8_ = auVar123._0_8_;
    fVar143 = auVar167._0_4_;
    auVar233._4_4_ = fVar143;
    auVar233._0_4_ = fVar143;
    auVar233._8_4_ = fVar143;
    auVar233._12_4_ = fVar143;
    auVar233._16_4_ = fVar143;
    auVar233._20_4_ = fVar143;
    auVar233._24_4_ = fVar143;
    auVar233._28_4_ = fVar143;
    auVar159 = vmovshdup_avx(auVar167);
    auVar248._0_8_ = auVar159._0_8_;
    auVar248._8_8_ = auVar248._0_8_;
    auVar248._16_8_ = auVar248._0_8_;
    auVar248._24_8_ = auVar248._0_8_;
    fVar125 = auVar189._0_4_;
    auVar188 = vmovshdup_avx(auVar189);
    auVar281 = vfmadd132ps_fma(auVar91,auVar262,_DAT_01faff20);
    auVar91 = vsubps_avx(auVar324,ZEXT1632(auVar281));
    fVar67 = auVar281._0_4_;
    fVar94 = auVar281._4_4_;
    auVar22._4_4_ = fVar145 * fVar94;
    auVar22._0_4_ = fVar145 * fVar67;
    fVar148 = auVar281._8_4_;
    auVar22._8_4_ = fVar145 * fVar148;
    fVar147 = auVar281._12_4_;
    auVar22._12_4_ = fVar145 * fVar147;
    auVar22._16_4_ = fVar145 * 0.0;
    auVar22._20_4_ = fVar145 * 0.0;
    auVar22._24_4_ = fVar145 * 0.0;
    auVar22._28_4_ = 0x3f800000;
    auVar281 = vfmadd231ps_fma(auVar22,auVar91,auVar317);
    fVar95 = auVar16._0_4_;
    fVar146 = auVar16._4_4_;
    auVar23._4_4_ = fVar146 * fVar94;
    auVar23._0_4_ = fVar95 * fVar67;
    auVar23._8_4_ = fVar95 * fVar148;
    auVar23._12_4_ = fVar146 * fVar147;
    auVar23._16_4_ = fVar95 * 0.0;
    auVar23._20_4_ = fVar146 * 0.0;
    auVar23._24_4_ = fVar95 * 0.0;
    auVar23._28_4_ = uVar68;
    auVar70 = vfmadd231ps_fma(auVar23,auVar91,auVar307);
    auVar24._4_4_ = fVar143 * fVar94;
    auVar24._0_4_ = fVar143 * fVar67;
    auVar24._8_4_ = fVar143 * fVar148;
    auVar24._12_4_ = fVar143 * fVar147;
    auVar24._16_4_ = fVar143 * 0.0;
    auVar24._20_4_ = fVar143 * 0.0;
    auVar24._24_4_ = fVar143 * 0.0;
    auVar24._28_4_ = auVar21._4_4_;
    auVar69 = vfmadd231ps_fma(auVar24,auVar91,auVar294);
    fVar95 = auVar159._0_4_;
    fVar146 = auVar159._4_4_;
    auVar15._4_4_ = fVar146 * fVar94;
    auVar15._0_4_ = fVar95 * fVar67;
    auVar15._8_4_ = fVar95 * fVar148;
    auVar15._12_4_ = fVar146 * fVar147;
    auVar15._16_4_ = fVar95 * 0.0;
    auVar15._20_4_ = fVar146 * 0.0;
    auVar15._24_4_ = fVar95 * 0.0;
    auVar15._28_4_ = fVar145;
    auVar156 = vfmadd231ps_fma(auVar15,auVar91,auVar123);
    auVar21 = vshufps_avx(auVar20,auVar20,0xaa);
    local_458._8_8_ = auVar21._0_8_;
    local_458._0_8_ = local_458._8_8_;
    local_458._16_8_ = local_458._8_8_;
    local_458._24_8_ = local_458._8_8_;
    auVar16 = vshufps_avx(auVar20,auVar20,0xff);
    uStack_4d0 = auVar16._0_8_;
    local_4d8 = (undefined1  [8])uStack_4d0;
    uStack_4c8 = uStack_4d0;
    uStack_4c0 = uStack_4d0;
    auVar25._4_4_ = fVar125 * fVar94;
    auVar25._0_4_ = fVar125 * fVar67;
    auVar25._8_4_ = fVar125 * fVar148;
    auVar25._12_4_ = fVar125 * fVar147;
    auVar25._16_4_ = fVar125 * 0.0;
    auVar25._20_4_ = fVar125 * 0.0;
    auVar25._24_4_ = fVar125 * 0.0;
    auVar25._28_4_ = fVar125;
    auVar20 = vfmadd231ps_fma(auVar25,auVar91,auVar233);
    auVar16 = vshufps_avx(auVar290,auVar290,0xaa);
    auVar234._0_8_ = auVar16._0_8_;
    auVar234._8_8_ = auVar234._0_8_;
    auVar234._16_8_ = auVar234._0_8_;
    auVar234._24_8_ = auVar234._0_8_;
    auVar159 = vshufps_avx(auVar290,auVar290,0xff);
    uStack_3f0 = auVar159._0_8_;
    local_3f8 = (undefined1  [8])uStack_3f0;
    uStack_3e8 = uStack_3f0;
    uStack_3e0 = uStack_3f0;
    fVar95 = auVar188._0_4_;
    fVar146 = auVar188._4_4_;
    auVar27._4_4_ = fVar146 * fVar94;
    auVar27._0_4_ = fVar95 * fVar67;
    auVar27._8_4_ = fVar95 * fVar148;
    auVar27._12_4_ = fVar146 * fVar147;
    auVar27._16_4_ = fVar95 * 0.0;
    auVar27._20_4_ = fVar146 * 0.0;
    auVar27._24_4_ = fVar95 * 0.0;
    auVar27._28_4_ = auVar21._4_4_;
    auVar98 = vfmadd231ps_fma(auVar27,auVar91,auVar248);
    auVar296._28_4_ = fVar146;
    auVar296._0_28_ =
         ZEXT1628(CONCAT412(auVar69._12_4_ * fVar147,
                            CONCAT48(auVar69._8_4_ * fVar148,
                                     CONCAT44(auVar69._4_4_ * fVar94,auVar69._0_4_ * fVar67))));
    auVar281 = vfmadd231ps_fma(auVar296,auVar91,ZEXT1632(auVar281));
    fVar95 = auVar159._4_4_;
    auVar28._28_4_ = fVar95;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar156._12_4_ * fVar147,
                            CONCAT48(auVar156._8_4_ * fVar148,
                                     CONCAT44(auVar156._4_4_ * fVar94,auVar156._0_4_ * fVar67))));
    auVar70 = vfmadd231ps_fma(auVar28,auVar91,ZEXT1632(auVar70));
    auVar21 = vshufps_avx(auVar167,auVar167,0xaa);
    uVar97 = auVar21._0_8_;
    auVar217._8_8_ = uVar97;
    auVar217._0_8_ = uVar97;
    auVar217._16_8_ = uVar97;
    auVar217._24_8_ = uVar97;
    auVar188 = vshufps_avx(auVar167,auVar167,0xff);
    uVar97 = auVar188._0_8_;
    auVar325._8_8_ = uVar97;
    auVar325._0_8_ = uVar97;
    auVar325._16_8_ = uVar97;
    auVar325._24_8_ = uVar97;
    auVar167 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar20._12_4_ * fVar147,
                                                  CONCAT48(auVar20._8_4_ * fVar148,
                                                           CONCAT44(auVar20._4_4_ * fVar94,
                                                                    auVar20._0_4_ * fVar67)))),
                               auVar91,ZEXT1632(auVar69));
    auVar20 = vshufps_avx(auVar189,auVar189,0xaa);
    auVar290 = vshufps_avx(auVar189,auVar189,0xff);
    auVar189 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar98._12_4_,
                                                  CONCAT48(fVar148 * auVar98._8_4_,
                                                           CONCAT44(fVar94 * auVar98._4_4_,
                                                                    fVar67 * auVar98._0_4_)))),
                               auVar91,ZEXT1632(auVar156));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar167._12_4_,
                                                 CONCAT48(fVar148 * auVar167._8_4_,
                                                          CONCAT44(fVar94 * auVar167._4_4_,
                                                                   fVar67 * auVar167._0_4_)))),
                              auVar91,ZEXT1632(auVar281));
    auVar22 = vsubps_avx(ZEXT1632(auVar167),ZEXT1632(auVar281));
    auVar167 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar189._12_4_,
                                                  CONCAT48(fVar148 * auVar189._8_4_,
                                                           CONCAT44(fVar94 * auVar189._4_4_,
                                                                    fVar67 * auVar189._0_4_)))),
                               auVar91,ZEXT1632(auVar70));
    auVar23 = vsubps_avx(ZEXT1632(auVar189),ZEXT1632(auVar70));
    fStack_2fc = auVar23._28_4_;
    auVar295._0_4_ = fStack_120 * auVar22._0_4_ * 3.0;
    auVar295._4_4_ = fStack_120 * auVar22._4_4_ * 3.0;
    auVar295._8_4_ = fStack_120 * auVar22._8_4_ * 3.0;
    auVar295._12_4_ = fStack_120 * auVar22._12_4_ * 3.0;
    auVar295._16_4_ = fStack_120 * auVar22._16_4_ * 3.0;
    auVar295._20_4_ = fStack_120 * auVar22._20_4_ * 3.0;
    auVar295._24_4_ = fStack_120 * auVar22._24_4_ * 3.0;
    auVar295._28_4_ = 0;
    local_318._0_4_ = fStack_120 * auVar23._0_4_ * 3.0;
    local_318._4_4_ = fStack_120 * auVar23._4_4_ * 3.0;
    fStack_310 = fStack_120 * auVar23._8_4_ * 3.0;
    fStack_30c = fStack_120 * auVar23._12_4_ * 3.0;
    fStack_308 = fStack_120 * auVar23._16_4_ * 3.0;
    fStack_304 = fStack_120 * auVar23._20_4_ * 3.0;
    fStack_300 = fStack_120 * auVar23._24_4_ * 3.0;
    fVar146 = auVar16._0_4_;
    fVar125 = auVar16._4_4_;
    auVar29._4_4_ = fVar125 * fVar94;
    auVar29._0_4_ = fVar146 * fVar67;
    auVar29._8_4_ = fVar146 * fVar148;
    auVar29._12_4_ = fVar125 * fVar147;
    auVar29._16_4_ = fVar146 * 0.0;
    auVar29._20_4_ = fVar125 * 0.0;
    auVar29._24_4_ = fVar146 * 0.0;
    auVar29._28_4_ = fStack_2fc;
    auVar16 = vfmadd231ps_fma(auVar29,auVar91,local_458);
    fVar146 = auVar159._0_4_;
    auVar30._4_4_ = fVar95 * fVar94;
    auVar30._0_4_ = fVar146 * fVar67;
    auVar30._8_4_ = fVar146 * fVar148;
    auVar30._12_4_ = fVar95 * fVar147;
    auVar30._16_4_ = fVar146 * 0.0;
    auVar30._20_4_ = fVar95 * 0.0;
    auVar30._24_4_ = fVar146 * 0.0;
    auVar30._28_4_ = 0;
    auVar159 = vfmadd231ps_fma(auVar30,auVar91,_local_4d8);
    fVar95 = auVar21._0_4_;
    fVar146 = auVar21._4_4_;
    auVar31._4_4_ = fVar146 * fVar94;
    auVar31._0_4_ = fVar95 * fVar67;
    auVar31._8_4_ = fVar95 * fVar148;
    auVar31._12_4_ = fVar146 * fVar147;
    auVar31._16_4_ = fVar95 * 0.0;
    auVar31._20_4_ = fVar146 * 0.0;
    auVar31._24_4_ = fVar95 * 0.0;
    auVar31._28_4_ = auVar22._28_4_;
    auVar21 = vfmadd231ps_fma(auVar31,auVar91,auVar234);
    fVar95 = auVar188._0_4_;
    fVar143 = auVar188._4_4_;
    auVar32._4_4_ = fVar143 * fVar94;
    auVar32._0_4_ = fVar95 * fVar67;
    auVar32._8_4_ = fVar95 * fVar148;
    auVar32._12_4_ = fVar143 * fVar147;
    auVar32._16_4_ = fVar95 * 0.0;
    auVar32._20_4_ = fVar143 * 0.0;
    auVar32._24_4_ = fVar95 * 0.0;
    auVar32._28_4_ = fVar125;
    auVar188 = vfmadd231ps_fma(auVar32,auVar91,_local_3f8);
    _local_3f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar69));
    fVar95 = auVar20._0_4_;
    fVar146 = auVar20._4_4_;
    auVar33._4_4_ = fVar146 * fVar94;
    auVar33._0_4_ = fVar95 * fVar67;
    auVar33._8_4_ = fVar95 * fVar148;
    auVar33._12_4_ = fVar146 * fVar147;
    auVar33._16_4_ = fVar95 * 0.0;
    auVar33._20_4_ = fVar146 * 0.0;
    auVar33._24_4_ = fVar95 * 0.0;
    auVar33._28_4_ = fVar146;
    auVar20 = vfmadd231ps_fma(auVar33,auVar91,auVar217);
    _local_4d8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar167));
    auVar27 = _local_4d8;
    fVar95 = auVar290._0_4_;
    fVar146 = auVar290._4_4_;
    auVar34._4_4_ = fVar146 * fVar94;
    auVar34._0_4_ = fVar95 * fVar67;
    auVar34._8_4_ = fVar95 * fVar148;
    auVar34._12_4_ = fVar146 * fVar147;
    auVar34._16_4_ = fVar95 * 0.0;
    auVar34._20_4_ = fVar146 * 0.0;
    auVar34._24_4_ = fVar95 * 0.0;
    auVar34._28_4_ = fVar146;
    auVar290 = vfmadd231ps_fma(auVar34,auVar91,auVar325);
    auVar35._28_4_ = fVar143;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(auVar21._12_4_ * fVar147,
                            CONCAT48(auVar21._8_4_ * fVar148,
                                     CONCAT44(auVar21._4_4_ * fVar94,auVar21._0_4_ * fVar67))));
    auVar16 = vfmadd231ps_fma(auVar35,auVar91,ZEXT1632(auVar16));
    auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar188._12_4_,
                                                  CONCAT48(fVar148 * auVar188._8_4_,
                                                           CONCAT44(fVar94 * auVar188._4_4_,
                                                                    fVar67 * auVar188._0_4_)))),
                               auVar91,ZEXT1632(auVar159));
    local_458._0_4_ = auVar69._0_4_ + auVar295._0_4_;
    local_458._4_4_ = auVar69._4_4_ + auVar295._4_4_;
    local_458._8_4_ = auVar69._8_4_ + auVar295._8_4_;
    local_458._12_4_ = auVar69._12_4_ + auVar295._12_4_;
    local_458._16_4_ = auVar295._16_4_ + 0.0;
    local_458._20_4_ = auVar295._20_4_ + 0.0;
    local_458._24_4_ = auVar295._24_4_ + 0.0;
    local_458._28_4_ = 0;
    auVar21 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar20._12_4_ * fVar147,
                                                 CONCAT48(auVar20._8_4_ * fVar148,
                                                          CONCAT44(auVar20._4_4_ * fVar94,
                                                                   auVar20._0_4_ * fVar67)))),
                              auVar91,ZEXT1632(auVar21));
    auVar188 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar290._12_4_ * fVar147,
                                                  CONCAT48(auVar290._8_4_ * fVar148,
                                                           CONCAT44(auVar290._4_4_ * fVar94,
                                                                    auVar290._0_4_ * fVar67)))),
                               auVar91,ZEXT1632(auVar188));
    auVar20 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar147 * auVar21._12_4_,
                                                 CONCAT48(fVar148 * auVar21._8_4_,
                                                          CONCAT44(fVar94 * auVar21._4_4_,
                                                                   fVar67 * auVar21._0_4_)))),
                              auVar91,ZEXT1632(auVar16));
    auVar290 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar188._12_4_ * fVar147,
                                                  CONCAT48(auVar188._8_4_ * fVar148,
                                                           CONCAT44(auVar188._4_4_ * fVar94,
                                                                    auVar188._0_4_ * fVar67)))),
                               ZEXT1632(auVar159),auVar91);
    auVar91 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar16));
    auVar22 = vsubps_avx(ZEXT1632(auVar188),ZEXT1632(auVar159));
    auVar318._0_4_ = fStack_120 * auVar91._0_4_ * 3.0;
    auVar318._4_4_ = fStack_120 * auVar91._4_4_ * 3.0;
    auVar318._8_4_ = fStack_120 * auVar91._8_4_ * 3.0;
    auVar318._12_4_ = fStack_120 * auVar91._12_4_ * 3.0;
    auVar318._16_4_ = fStack_120 * auVar91._16_4_ * 3.0;
    auVar318._20_4_ = fStack_120 * auVar91._20_4_ * 3.0;
    auVar318._24_4_ = fStack_120 * auVar91._24_4_ * 3.0;
    auVar318._28_4_ = 0;
    local_138 = fStack_120 * auVar22._0_4_ * 3.0;
    fStack_134 = fStack_120 * auVar22._4_4_ * 3.0;
    auVar36._4_4_ = fStack_134;
    auVar36._0_4_ = local_138;
    fStack_130 = fStack_120 * auVar22._8_4_ * 3.0;
    auVar36._8_4_ = fStack_130;
    fStack_12c = fStack_120 * auVar22._12_4_ * 3.0;
    auVar36._12_4_ = fStack_12c;
    fStack_128 = fStack_120 * auVar22._16_4_ * 3.0;
    auVar36._16_4_ = fStack_128;
    fStack_124 = fStack_120 * auVar22._20_4_ * 3.0;
    auVar36._20_4_ = fStack_124;
    fStack_120 = fStack_120 * auVar22._24_4_ * 3.0;
    auVar36._24_4_ = fStack_120;
    auVar36._28_4_ = 0x40400000;
    _local_418 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar20));
    _local_3b8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar290));
    auVar91 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar69));
    auVar22 = vsubps_avx(ZEXT1632(auVar290),ZEXT1632(auVar167));
    auVar23 = vsubps_avx(_local_418,_local_3f8);
    fVar145 = auVar91._0_4_ + auVar23._0_4_;
    fVar181 = auVar91._4_4_ + auVar23._4_4_;
    fVar182 = auVar91._8_4_ + auVar23._8_4_;
    fVar183 = auVar91._12_4_ + auVar23._12_4_;
    fVar236 = auVar91._16_4_ + auVar23._16_4_;
    fVar237 = auVar91._20_4_ + auVar23._20_4_;
    fVar238 = auVar91._24_4_ + auVar23._24_4_;
    auVar24 = vsubps_avx(_local_3b8,_local_4d8);
    auVar92._0_4_ = auVar22._0_4_ + auVar24._0_4_;
    auVar92._4_4_ = auVar22._4_4_ + auVar24._4_4_;
    auVar92._8_4_ = auVar22._8_4_ + auVar24._8_4_;
    auVar92._12_4_ = auVar22._12_4_ + auVar24._12_4_;
    auVar92._16_4_ = auVar22._16_4_ + auVar24._16_4_;
    auVar92._20_4_ = auVar22._20_4_ + auVar24._20_4_;
    auVar92._24_4_ = auVar22._24_4_ + auVar24._24_4_;
    auVar92._28_4_ = auVar22._28_4_ + auVar24._28_4_;
    local_d8 = ZEXT1632(auVar167);
    fVar67 = auVar167._0_4_;
    local_158 = (float)local_318._0_4_ + fVar67;
    fVar94 = auVar167._4_4_;
    fStack_154 = (float)local_318._4_4_ + fVar94;
    fVar148 = auVar167._8_4_;
    fStack_150 = fStack_310 + fVar148;
    fVar147 = auVar167._12_4_;
    fStack_14c = fStack_30c + fVar147;
    fStack_148 = fStack_308 + 0.0;
    fStack_144 = fStack_304 + 0.0;
    fStack_140 = fStack_300 + 0.0;
    local_98 = ZEXT1632(auVar69);
    auVar22 = vsubps_avx(local_98,auVar295);
    local_b8 = vpermps_avx2(_DAT_01fec480,auVar22);
    auVar22 = vsubps_avx(local_d8,_local_318);
    local_178 = vpermps_avx2(_DAT_01fec480,auVar22);
    local_f8._0_4_ = auVar20._0_4_ + auVar318._0_4_;
    local_f8._4_4_ = auVar20._4_4_ + auVar318._4_4_;
    local_f8._8_4_ = auVar20._8_4_ + auVar318._8_4_;
    local_f8._12_4_ = auVar20._12_4_ + auVar318._12_4_;
    local_f8._16_4_ = auVar318._16_4_ + 0.0;
    local_f8._20_4_ = auVar318._20_4_ + 0.0;
    local_f8._24_4_ = auVar318._24_4_ + 0.0;
    local_f8._28_4_ = 0;
    auVar263 = ZEXT3264(local_f8);
    auVar296 = ZEXT1632(auVar20);
    auVar22 = vsubps_avx(auVar296,auVar318);
    auVar25 = vpermps_avx2(_DAT_01fec480,auVar22);
    fVar95 = auVar290._0_4_;
    local_138 = fVar95 + local_138;
    fVar146 = auVar290._4_4_;
    fStack_134 = fVar146 + fStack_134;
    fVar125 = auVar290._8_4_;
    fStack_130 = fVar125 + fStack_130;
    fVar143 = auVar290._12_4_;
    fStack_12c = fVar143 + fStack_12c;
    fStack_128 = fStack_128 + 0.0;
    fStack_124 = fStack_124 + 0.0;
    fStack_120 = fStack_120 + 0.0;
    auVar22 = vsubps_avx(ZEXT1632(auVar290),auVar36);
    local_118 = vpermps_avx2(_DAT_01fec480,auVar22);
    auVar37._4_4_ = fVar94 * fVar181;
    auVar37._0_4_ = fVar67 * fVar145;
    auVar37._8_4_ = fVar148 * fVar182;
    auVar37._12_4_ = fVar147 * fVar183;
    auVar37._16_4_ = fVar236 * 0.0;
    auVar37._20_4_ = fVar237 * 0.0;
    auVar37._24_4_ = fVar238 * 0.0;
    auVar37._28_4_ = auVar22._28_4_;
    auVar21 = vfnmadd231ps_fma(auVar37,local_98,auVar92);
    fStack_13c = fStack_2fc + 0.0;
    auVar38._4_4_ = fStack_154 * fVar181;
    auVar38._0_4_ = local_158 * fVar145;
    auVar38._8_4_ = fStack_150 * fVar182;
    auVar38._12_4_ = fStack_14c * fVar183;
    auVar38._16_4_ = fStack_148 * fVar236;
    auVar38._20_4_ = fStack_144 * fVar237;
    auVar38._24_4_ = fStack_140 * fVar238;
    auVar38._28_4_ = 0;
    auVar16 = vfnmadd231ps_fma(auVar38,auVar92,local_458);
    auVar39._4_4_ = local_178._4_4_ * fVar181;
    auVar39._0_4_ = local_178._0_4_ * fVar145;
    auVar39._8_4_ = local_178._8_4_ * fVar182;
    auVar39._12_4_ = local_178._12_4_ * fVar183;
    auVar39._16_4_ = local_178._16_4_ * fVar236;
    auVar39._20_4_ = local_178._20_4_ * fVar237;
    auVar39._24_4_ = local_178._24_4_ * fVar238;
    auVar39._28_4_ = fStack_2fc + 0.0;
    auVar159 = vfnmadd231ps_fma(auVar39,local_b8,auVar92);
    auVar40._4_4_ = (float)local_4d8._4_4_ * fVar181;
    auVar40._0_4_ = (float)local_4d8._0_4_ * fVar145;
    auVar40._8_4_ = (float)uStack_4d0 * fVar182;
    auVar40._12_4_ = uStack_4d0._4_4_ * fVar183;
    auVar40._16_4_ = (float)uStack_4c8 * fVar236;
    auVar40._20_4_ = uStack_4c8._4_4_ * fVar237;
    auVar40._24_4_ = (float)uStack_4c0 * fVar238;
    auVar40._28_4_ = uStack_4c0._4_4_;
    auVar188 = vfnmadd231ps_fma(auVar40,_local_3f8,auVar92);
    auVar249._0_4_ = fVar95 * fVar145;
    auVar249._4_4_ = fVar146 * fVar181;
    auVar249._8_4_ = fVar125 * fVar182;
    auVar249._12_4_ = fVar143 * fVar183;
    auVar249._16_4_ = fVar236 * 0.0;
    auVar249._20_4_ = fVar237 * 0.0;
    auVar249._24_4_ = fVar238 * 0.0;
    auVar249._28_4_ = 0;
    auVar20 = vfnmadd231ps_fma(auVar249,auVar296,auVar92);
    uStack_11c = 0x40400000;
    auVar41._4_4_ = fStack_134 * fVar181;
    auVar41._0_4_ = local_138 * fVar145;
    auVar41._8_4_ = fStack_130 * fVar182;
    auVar41._12_4_ = fStack_12c * fVar183;
    auVar41._16_4_ = fStack_128 * fVar236;
    auVar41._20_4_ = fStack_124 * fVar237;
    auVar41._24_4_ = fStack_120 * fVar238;
    auVar41._28_4_ = local_3f8._28_4_;
    auVar167 = vfnmadd231ps_fma(auVar41,local_f8,auVar92);
    auVar42._4_4_ = local_118._4_4_ * fVar181;
    auVar42._0_4_ = local_118._0_4_ * fVar145;
    auVar42._8_4_ = local_118._8_4_ * fVar182;
    auVar42._12_4_ = local_118._12_4_ * fVar183;
    auVar42._16_4_ = local_118._16_4_ * fVar236;
    auVar42._20_4_ = local_118._20_4_ * fVar237;
    auVar42._24_4_ = local_118._24_4_ * fVar238;
    auVar42._28_4_ = local_118._28_4_;
    _local_318 = auVar25;
    auVar189 = vfnmadd231ps_fma(auVar42,auVar25,auVar92);
    auVar43._4_4_ = local_3b8._4_4_ * fVar181;
    auVar43._0_4_ = local_3b8._0_4_ * fVar145;
    auVar43._8_4_ = local_3b8._8_4_ * fVar182;
    auVar43._12_4_ = local_3b8._12_4_ * fVar183;
    auVar43._16_4_ = local_3b8._16_4_ * fVar236;
    auVar43._20_4_ = local_3b8._20_4_ * fVar237;
    auVar43._24_4_ = local_3b8._24_4_ * fVar238;
    auVar43._28_4_ = auVar91._28_4_ + auVar23._28_4_;
    auVar281 = vfnmadd231ps_fma(auVar43,_local_418,auVar92);
    auVar22 = vminps_avx(ZEXT1632(auVar21),ZEXT1632(auVar16));
    auVar91 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar16));
    auVar23 = vminps_avx(ZEXT1632(auVar159),ZEXT1632(auVar188));
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar159),ZEXT1632(auVar188));
    auVar91 = vmaxps_avx(auVar91,auVar22);
    auVar24 = vminps_avx(ZEXT1632(auVar20),ZEXT1632(auVar167));
    auVar22 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar167));
    auVar15 = vminps_avx(ZEXT1632(auVar189),ZEXT1632(auVar281));
    auVar24 = vminps_avx(auVar24,auVar15);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar189),ZEXT1632(auVar281));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar91,auVar22);
    auVar52._4_4_ = fStack_1d4;
    auVar52._0_4_ = local_1d8;
    auVar52._8_4_ = fStack_1d0;
    auVar52._12_4_ = fStack_1cc;
    auVar52._16_4_ = fStack_1c8;
    auVar52._20_4_ = fStack_1c4;
    auVar52._24_4_ = fStack_1c0;
    auVar52._28_4_ = fStack_1bc;
    auVar91 = vcmpps_avx(auVar24,auVar52,2);
    auVar54._4_4_ = uStack_74;
    auVar54._0_4_ = local_78;
    auVar54._8_4_ = uStack_70;
    auVar54._12_4_ = uStack_6c;
    auVar54._16_4_ = uStack_68;
    auVar54._20_4_ = uStack_64;
    auVar54._24_4_ = uStack_60;
    auVar54._28_4_ = uStack_5c;
    auVar22 = vcmpps_avx(auVar22,auVar54,5);
    auVar91 = vandps_avx(auVar22,auVar91);
    auVar22 = local_198 & auVar91;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(_local_3f8,local_98);
      auVar23 = vsubps_avx(_local_418,auVar296);
      fVar181 = auVar22._0_4_ + auVar23._0_4_;
      fVar182 = auVar22._4_4_ + auVar23._4_4_;
      fVar183 = auVar22._8_4_ + auVar23._8_4_;
      fVar236 = auVar22._12_4_ + auVar23._12_4_;
      fVar237 = auVar22._16_4_ + auVar23._16_4_;
      fVar238 = auVar22._20_4_ + auVar23._20_4_;
      fVar96 = auVar22._24_4_ + auVar23._24_4_;
      auVar24 = vsubps_avx(_local_4d8,local_d8);
      auVar15 = vsubps_avx(_local_3b8,ZEXT1632(auVar290));
      auVar124._0_4_ = auVar24._0_4_ + auVar15._0_4_;
      auVar124._4_4_ = auVar24._4_4_ + auVar15._4_4_;
      auVar124._8_4_ = auVar24._8_4_ + auVar15._8_4_;
      auVar124._12_4_ = auVar24._12_4_ + auVar15._12_4_;
      auVar124._16_4_ = auVar24._16_4_ + auVar15._16_4_;
      auVar124._20_4_ = auVar24._20_4_ + auVar15._20_4_;
      auVar124._24_4_ = auVar24._24_4_ + auVar15._24_4_;
      fVar145 = auVar15._28_4_;
      auVar124._28_4_ = auVar24._28_4_ + fVar145;
      auVar44._4_4_ = fVar94 * fVar182;
      auVar44._0_4_ = fVar67 * fVar181;
      auVar44._8_4_ = fVar148 * fVar183;
      auVar44._12_4_ = fVar147 * fVar236;
      auVar44._16_4_ = fVar237 * 0.0;
      auVar44._20_4_ = fVar238 * 0.0;
      auVar44._24_4_ = fVar96 * 0.0;
      auVar44._28_4_ = local_418._28_4_;
      auVar20 = vfnmadd231ps_fma(auVar44,auVar124,local_98);
      auVar45._4_4_ = fVar182 * fStack_154;
      auVar45._0_4_ = fVar181 * local_158;
      auVar45._8_4_ = fVar183 * fStack_150;
      auVar45._12_4_ = fVar236 * fStack_14c;
      auVar45._16_4_ = fVar237 * fStack_148;
      auVar45._20_4_ = fVar238 * fStack_144;
      auVar45._24_4_ = fVar96 * fStack_140;
      auVar45._28_4_ = 0;
      auVar21 = vfnmadd213ps_fma(local_458,auVar124,auVar45);
      auVar46._4_4_ = fVar182 * local_178._4_4_;
      auVar46._0_4_ = fVar181 * local_178._0_4_;
      auVar46._8_4_ = fVar183 * local_178._8_4_;
      auVar46._12_4_ = fVar236 * local_178._12_4_;
      auVar46._16_4_ = fVar237 * local_178._16_4_;
      auVar46._20_4_ = fVar238 * local_178._20_4_;
      auVar46._24_4_ = fVar96 * local_178._24_4_;
      auVar46._28_4_ = 0;
      auVar16 = vfnmadd213ps_fma(local_b8,auVar124,auVar46);
      auVar47._4_4_ = (float)local_4d8._4_4_ * fVar182;
      auVar47._0_4_ = (float)local_4d8._0_4_ * fVar181;
      auVar47._8_4_ = (float)uStack_4d0 * fVar183;
      auVar47._12_4_ = uStack_4d0._4_4_ * fVar236;
      auVar47._16_4_ = (float)uStack_4c8 * fVar237;
      auVar47._20_4_ = uStack_4c8._4_4_ * fVar238;
      auVar47._24_4_ = (float)uStack_4c0 * fVar96;
      auVar47._28_4_ = 0;
      auVar290 = vfnmadd231ps_fma(auVar47,auVar124,_local_3f8);
      auVar163._0_4_ = fVar95 * fVar181;
      auVar163._4_4_ = fVar146 * fVar182;
      auVar163._8_4_ = fVar125 * fVar183;
      auVar163._12_4_ = fVar143 * fVar236;
      auVar163._16_4_ = fVar237 * 0.0;
      auVar163._20_4_ = fVar238 * 0.0;
      auVar163._24_4_ = fVar96 * 0.0;
      auVar163._28_4_ = 0;
      auVar167 = vfnmadd231ps_fma(auVar163,auVar124,auVar296);
      auVar48._4_4_ = fVar182 * fStack_134;
      auVar48._0_4_ = fVar181 * local_138;
      auVar48._8_4_ = fVar183 * fStack_130;
      auVar48._12_4_ = fVar236 * fStack_12c;
      auVar48._16_4_ = fVar237 * fStack_128;
      auVar48._20_4_ = fVar238 * fStack_124;
      auVar48._24_4_ = fVar96 * fStack_120;
      auVar48._28_4_ = fVar145;
      auVar159 = vfnmadd213ps_fma(local_f8,auVar124,auVar48);
      auVar49._4_4_ = fVar182 * local_118._4_4_;
      auVar49._0_4_ = fVar181 * local_118._0_4_;
      auVar49._8_4_ = fVar183 * local_118._8_4_;
      auVar49._12_4_ = fVar236 * local_118._12_4_;
      auVar49._16_4_ = fVar237 * local_118._16_4_;
      auVar49._20_4_ = fVar238 * local_118._20_4_;
      auVar49._24_4_ = fVar96 * local_118._24_4_;
      auVar49._28_4_ = fVar145;
      auVar188 = vfnmadd213ps_fma(auVar25,auVar124,auVar49);
      auVar263 = ZEXT1664(auVar188);
      auVar50._4_4_ = fVar182 * local_3b8._4_4_;
      auVar50._0_4_ = fVar181 * local_3b8._0_4_;
      auVar50._8_4_ = fVar183 * local_3b8._8_4_;
      auVar50._12_4_ = fVar236 * local_3b8._12_4_;
      auVar50._16_4_ = fVar237 * local_3b8._16_4_;
      auVar50._20_4_ = fVar238 * local_3b8._20_4_;
      auVar50._24_4_ = fVar96 * local_3b8._24_4_;
      auVar50._28_4_ = auVar22._28_4_ + auVar23._28_4_;
      auVar189 = vfnmadd231ps_fma(auVar50,auVar124,_local_418);
      auVar23 = vminps_avx(ZEXT1632(auVar20),ZEXT1632(auVar21));
      auVar22 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar21));
      auVar24 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar290));
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar290));
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar15 = vminps_avx(ZEXT1632(auVar167),ZEXT1632(auVar159));
      auVar23 = vmaxps_avx(ZEXT1632(auVar167),ZEXT1632(auVar159));
      auVar25 = vminps_avx(ZEXT1632(auVar188),ZEXT1632(auVar189));
      auVar15 = vminps_avx(auVar15,auVar25);
      auVar15 = vminps_avx(auVar24,auVar15);
      auVar24 = vmaxps_avx(ZEXT1632(auVar188),ZEXT1632(auVar189));
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar22,auVar23);
      auVar53._4_4_ = fStack_1d4;
      auVar53._0_4_ = local_1d8;
      auVar53._8_4_ = fStack_1d0;
      auVar53._12_4_ = fStack_1cc;
      auVar53._16_4_ = fStack_1c8;
      auVar53._20_4_ = fStack_1c4;
      auVar53._24_4_ = fStack_1c0;
      auVar53._28_4_ = fStack_1bc;
      auVar22 = vcmpps_avx(auVar15,auVar53,2);
      auVar23 = vcmpps_avx(auVar23,auVar54,5);
      auVar22 = vandps_avx(auVar23,auVar22);
      auVar91 = vandps_avx(auVar91,local_198);
      auVar23 = auVar91 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar91 = vandps_avx(auVar22,auVar91);
        uVar64 = vmovmskps_avx(auVar91);
        if (uVar64 != 0) {
          uVar60 = (ulong)uVar65;
          auStack_2a8[uVar60] = uVar64 & 0xff;
          uVar97 = vmovlps_avx(local_218);
          *(undefined8 *)(&uStack_1b8 + uVar60 * 2) = uVar97;
          uVar59 = vmovlps_avx(auVar78);
          auStack_58[uVar60] = uVar59;
          uVar65 = uVar65 + 1;
        }
      }
    }
    _local_4d8 = auVar27;
    if (uVar65 != 0) {
      do {
        uVar60 = (ulong)(uVar65 - 1);
        uVar63 = auStack_2a8[uVar60];
        uVar64 = (&uStack_1b8)[uVar60 * 2];
        fVar67 = afStack_1b4[uVar60 * 2];
        iVar26 = 0;
        for (uVar59 = (ulong)uVar63; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
          iVar26 = iVar26 + 1;
        }
        uVar63 = uVar63 - 1 & uVar63;
        if (uVar63 == 0) {
          uVar65 = uVar65 - 1;
        }
        auVar78._8_8_ = 0;
        auVar78._0_8_ = auStack_58[uVar60];
        auStack_2a8[uVar60] = uVar63;
        fVar94 = (float)(iVar26 + 1) * 0.14285715;
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * (float)iVar26 * 0.14285715)),
                                  ZEXT416(uVar64),ZEXT416((uint)(1.0 - (float)iVar26 * 0.14285715)))
        ;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar94)),ZEXT416(uVar64),
                                  ZEXT416((uint)(1.0 - fVar94)));
        fVar94 = auVar16._0_4_;
        auVar235._0_4_ = auVar21._0_4_;
        fVar67 = fVar94 - auVar235._0_4_;
        if (0.16666667 <= fVar67) {
          local_218 = vinsertps_avx(auVar21,auVar16,0x10);
          goto LAB_016d5c3a;
        }
        auVar159 = vshufps_avx(auVar78,auVar78,0x50);
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar188 = vsubps_avx(auVar113,auVar159);
        fVar148 = auVar159._0_4_;
        auVar176._0_4_ = fVar148 * (float)local_498._0_4_;
        fVar147 = auVar159._4_4_;
        auVar176._4_4_ = fVar147 * (float)local_498._4_4_;
        fVar95 = auVar159._8_4_;
        auVar176._8_4_ = fVar95 * fStack_490;
        fVar146 = auVar159._12_4_;
        auVar176._12_4_ = fVar146 * fStack_48c;
        auVar192._0_4_ = fVar144 * fVar148;
        auVar192._4_4_ = fVar165 * fVar147;
        auVar192._8_4_ = fVar144 * fVar95;
        auVar192._12_4_ = fVar165 * fVar146;
        auVar214._0_4_ = fVar250 * fVar148;
        auVar214._4_4_ = fVar251 * fVar147;
        auVar214._8_4_ = fVar250 * fVar95;
        auVar214._12_4_ = fVar251 * fVar146;
        auVar80._0_4_ = fVar148 * (float)local_328._0_4_;
        auVar80._4_4_ = fVar147 * (float)local_328._4_4_;
        auVar80._8_4_ = fVar95 * fStack_320;
        auVar80._12_4_ = fVar146 * fStack_31c;
        auVar159 = vfmadd231ps_fma(auVar176,auVar188,auVar244);
        auVar20 = vfmadd231ps_fma(auVar192,auVar188,local_468);
        auVar290 = vfmadd231ps_fma(auVar214,auVar188,local_478);
        auVar188 = vfmadd231ps_fma(auVar80,auVar188,local_488);
        auVar164._16_16_ = auVar159;
        auVar164._0_16_ = auVar159;
        auVar180._16_16_ = auVar20;
        auVar180._0_16_ = auVar20;
        auVar201._16_16_ = auVar290;
        auVar201._0_16_ = auVar290;
        _local_4d8 = auVar21;
        auVar235._4_4_ = auVar235._0_4_;
        auVar235._8_4_ = auVar235._0_4_;
        auVar235._12_4_ = auVar235._0_4_;
        auVar235._20_4_ = fVar94;
        auVar235._16_4_ = fVar94;
        auVar235._24_4_ = fVar94;
        auVar235._28_4_ = fVar94;
        auVar91 = vsubps_avx(auVar180,auVar164);
        auVar20 = vfmadd213ps_fma(auVar91,auVar235,auVar164);
        auVar91 = vsubps_avx(auVar201,auVar180);
        auVar167 = vfmadd213ps_fma(auVar91,auVar235,auVar180);
        auVar159 = vsubps_avx(auVar188,auVar290);
        auVar93._16_16_ = auVar159;
        auVar93._0_16_ = auVar159;
        auVar159 = vfmadd213ps_fma(auVar93,auVar235,auVar201);
        auVar91 = vsubps_avx(ZEXT1632(auVar167),ZEXT1632(auVar20));
        auVar188 = vfmadd213ps_fma(auVar91,auVar235,ZEXT1632(auVar20));
        auVar91 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar167));
        auVar159 = vfmadd213ps_fma(auVar91,auVar235,ZEXT1632(auVar167));
        auVar91 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar188));
        auVar70 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar91,auVar235);
        fVar143 = auVar91._4_4_ * 3.0;
        local_3f8._0_4_ = fVar67;
        fVar148 = fVar67 * 0.33333334;
        auVar227._0_8_ =
             CONCAT44(auVar70._4_4_ + fVar148 * fVar143,
                      auVar70._0_4_ + fVar148 * auVar91._0_4_ * 3.0);
        auVar227._8_4_ = auVar70._8_4_ + fVar148 * auVar91._8_4_ * 3.0;
        auVar227._12_4_ = auVar70._12_4_ + fVar148 * auVar91._12_4_ * 3.0;
        auVar188 = vshufpd_avx(auVar70,auVar70,3);
        auVar20 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        _local_3b8 = auVar188;
        auVar159 = vsubps_avx(auVar188,auVar70);
        _local_418 = auVar20;
        auVar290 = vsubps_avx(auVar20,(undefined1  [16])0x0);
        auVar81._0_4_ = auVar159._0_4_ + auVar290._0_4_;
        auVar81._4_4_ = auVar159._4_4_ + auVar290._4_4_;
        auVar81._8_4_ = auVar159._8_4_ + auVar290._8_4_;
        auVar81._12_4_ = auVar159._12_4_ + auVar290._12_4_;
        auVar159 = vshufps_avx(auVar70,auVar70,0xb1);
        auVar290 = vshufps_avx(auVar227,auVar227,0xb1);
        auVar314._4_4_ = auVar81._0_4_;
        auVar314._0_4_ = auVar81._0_4_;
        auVar314._8_4_ = auVar81._0_4_;
        auVar314._12_4_ = auVar81._0_4_;
        auVar167 = vshufps_avx(auVar81,auVar81,0x55);
        fVar147 = auVar167._0_4_;
        auVar82._0_4_ = fVar147 * auVar159._0_4_;
        fVar95 = auVar167._4_4_;
        auVar82._4_4_ = fVar95 * auVar159._4_4_;
        fVar146 = auVar167._8_4_;
        auVar82._8_4_ = fVar146 * auVar159._8_4_;
        fVar125 = auVar167._12_4_;
        auVar82._12_4_ = fVar125 * auVar159._12_4_;
        auVar193._0_4_ = fVar147 * auVar290._0_4_;
        auVar193._4_4_ = fVar95 * auVar290._4_4_;
        auVar193._8_4_ = fVar146 * auVar290._8_4_;
        auVar193._12_4_ = fVar125 * auVar290._12_4_;
        auVar189 = vfmadd231ps_fma(auVar82,auVar314,auVar70);
        _local_318 = auVar227;
        auVar281 = vfmadd231ps_fma(auVar193,auVar314,auVar227);
        auVar290 = vshufps_avx(auVar189,auVar189,0xe8);
        auVar167 = vshufps_avx(auVar281,auVar281,0xe8);
        auVar159 = vcmpps_avx(auVar290,auVar167,1);
        uVar64 = vextractps_avx(auVar159,0);
        auVar69 = auVar281;
        if ((uVar64 & 1) == 0) {
          auVar69 = auVar189;
        }
        local_458._0_16_ = auVar16;
        auVar155._0_4_ = fVar148 * auVar91._16_4_ * 3.0;
        auVar155._4_4_ = fVar148 * fVar143;
        auVar155._8_4_ = fVar148 * auVar91._24_4_ * 3.0;
        auVar155._12_4_ = fVar148 * auVar263._28_4_;
        auVar100 = vsubps_avx((undefined1  [16])0x0,auVar155);
        auVar156 = vshufps_avx(auVar100,auVar100,0xb1);
        auVar98 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar228._0_4_ = fVar147 * auVar156._0_4_;
        auVar228._4_4_ = fVar95 * auVar156._4_4_;
        auVar228._8_4_ = fVar146 * auVar156._8_4_;
        auVar228._12_4_ = fVar125 * auVar156._12_4_;
        auVar245._0_4_ = auVar98._0_4_ * fVar147;
        auVar245._4_4_ = auVar98._4_4_ * fVar95;
        auVar245._8_4_ = auVar98._8_4_ * fVar146;
        auVar245._12_4_ = auVar98._12_4_ * fVar125;
        auVar106 = vfmadd231ps_fma(auVar228,auVar314,auVar100);
        auVar126 = vfmadd231ps_fma(auVar245,(undefined1  [16])0x0,auVar314);
        auVar98 = vshufps_avx(auVar106,auVar106,0xe8);
        auVar99 = vshufps_avx(auVar126,auVar126,0xe8);
        auVar263 = ZEXT1664(auVar99);
        auVar156 = vcmpps_avx(auVar98,auVar99,1);
        uVar64 = vextractps_avx(auVar156,0);
        auVar127 = auVar126;
        if ((uVar64 & 1) == 0) {
          auVar127 = auVar106;
        }
        auVar69 = vmaxss_avx(auVar127,auVar69);
        auVar290 = vminps_avx(auVar290,auVar167);
        auVar167 = vminps_avx(auVar98,auVar99);
        auVar167 = vminps_avx(auVar290,auVar167);
        auVar159 = vshufps_avx(auVar159,auVar159,0x55);
        auVar159 = vblendps_avx(auVar159,auVar156,2);
        auVar156 = vpslld_avx(auVar159,0x1f);
        auVar159 = vshufpd_avx(auVar281,auVar281,1);
        auVar159 = vinsertps_avx(auVar159,auVar126,0x9c);
        auVar290 = vshufpd_avx(auVar189,auVar189,1);
        auVar290 = vinsertps_avx(auVar290,auVar106,0x9c);
        auVar159 = vblendvps_avx(auVar290,auVar159,auVar156);
        auVar290 = vmovshdup_avx(auVar159);
        auVar159 = vmaxss_avx(auVar290,auVar159);
        fVar146 = auVar167._0_4_;
        auVar290 = vmovshdup_avx(auVar167);
        fVar95 = auVar159._0_4_;
        fVar148 = auVar290._0_4_;
        fVar147 = auVar69._0_4_;
        if (((fVar146 < 0.0001) && (-0.0001 < fVar95)) || (fVar148 < 0.0001 && -0.0001 < fVar95)) {
LAB_016d64f5:
          auVar189 = vcmpps_avx(auVar167,_DAT_01f7aa10,1);
          auVar281 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar290 = vcmpss_avx(auVar69,ZEXT816(0) << 0x20,1);
          auVar114._8_4_ = 0x3f800000;
          auVar114._0_8_ = 0x3f8000003f800000;
          auVar114._12_4_ = 0x3f800000;
          auVar135._8_4_ = 0xbf800000;
          auVar135._0_8_ = 0xbf800000bf800000;
          auVar135._12_4_ = 0xbf800000;
          auVar290 = vblendvps_avx(auVar114,auVar135,auVar290);
          auVar189 = vblendvps_avx(auVar114,auVar135,auVar189);
          fVar143 = auVar189._0_4_;
          fVar125 = auVar290._0_4_;
          auVar290 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar143 == fVar125) && (!NAN(fVar143) && !NAN(fVar125))) {
            auVar290 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar143 == fVar125) && (!NAN(fVar143) && !NAN(fVar125))) {
            auVar281 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar189 = vmovshdup_avx(auVar189);
          fVar145 = auVar189._0_4_;
          if ((fVar143 != fVar145) || (NAN(fVar143) || NAN(fVar145))) {
            if ((fVar148 != fVar146) || (NAN(fVar148) || NAN(fVar146))) {
              auVar157._0_4_ = (float)((uint)fVar146 ^ local_338);
              auVar157._4_4_ = auVar167._4_4_ ^ uStack_334;
              auVar157._8_4_ = auVar167._8_4_ ^ uStack_330;
              auVar157._12_4_ = auVar167._12_4_ ^ uStack_32c;
              auVar158._0_4_ = auVar157._0_4_ / (fVar148 - fVar146);
              auVar158._4_12_ = auVar157._4_12_;
              auVar167 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar158._0_4_)),auVar158,ZEXT416(0));
              auVar189 = auVar167;
            }
            else {
              auVar167 = ZEXT816(0) << 0x20;
              if ((fVar146 != 0.0) || (auVar189 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar146))) {
                auVar167 = SUB6416(ZEXT464(0x7f800000),0);
                auVar189 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar290 = vminss_avx(auVar290,auVar167);
            auVar281 = vmaxss_avx(auVar189,auVar281);
          }
          auVar159 = vcmpss_avx(auVar159,ZEXT416(0),1);
          auVar115._8_4_ = 0x3f800000;
          auVar115._0_8_ = 0x3f8000003f800000;
          auVar115._12_4_ = 0x3f800000;
          auVar136._8_4_ = 0xbf800000;
          auVar136._0_8_ = 0xbf800000bf800000;
          auVar136._12_4_ = 0xbf800000;
          auVar159 = vblendvps_avx(auVar115,auVar136,auVar159);
          fVar148 = auVar159._0_4_;
          if ((fVar125 != fVar148) || (NAN(fVar125) || NAN(fVar148))) {
            if ((fVar95 != fVar147) || (NAN(fVar95) || NAN(fVar147))) {
              auVar83._0_4_ = (float)((uint)fVar147 ^ local_338);
              auVar83._4_4_ = auVar69._4_4_ ^ uStack_334;
              auVar83._8_4_ = auVar69._8_4_ ^ uStack_330;
              auVar83._12_4_ = auVar69._12_4_ ^ uStack_32c;
              auVar160._0_4_ = auVar83._0_4_ / (fVar95 - fVar147);
              auVar160._4_12_ = auVar83._4_12_;
              auVar159 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar160._0_4_)),auVar160,ZEXT416(0));
              auVar167 = auVar159;
            }
            else {
              auVar159 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar147 != 0.0) || (auVar167 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar147))) {
                auVar159 = SUB6416(ZEXT464(0xff800000),0);
                auVar167 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar290 = vminss_avx(auVar290,auVar167);
            auVar281 = vmaxss_avx(auVar159,auVar281);
          }
          if ((fVar145 != fVar148) || (NAN(fVar145) || NAN(fVar148))) {
            auVar290 = vminss_avx(auVar290,SUB6416(ZEXT464(0x3f800000),0));
            auVar281 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar281);
          }
          auVar159 = vmaxss_avx(ZEXT816(0) << 0x40,auVar290);
          auVar290 = vminss_avx(auVar281,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar159._0_4_ <= auVar290._0_4_) {
            auVar159 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar159._0_4_ + -0.1)));
            auVar290 = vminss_avx(ZEXT416((uint)(auVar290._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar177._0_8_ = auVar70._0_8_;
            auVar177._8_8_ = auVar177._0_8_;
            auVar255._8_8_ = auVar227._0_8_;
            auVar255._0_8_ = auVar227._0_8_;
            auVar268._8_8_ = auVar100._0_8_;
            auVar268._0_8_ = auVar100._0_8_;
            auVar167 = vshufpd_avx(auVar227,auVar227,3);
            auVar189 = vshufpd_avx(auVar100,auVar100,3);
            auVar281 = vshufps_avx(auVar159,auVar290,0);
            auVar84._8_4_ = 0x3f800000;
            auVar84._0_8_ = 0x3f8000003f800000;
            auVar84._12_4_ = 0x3f800000;
            auVar70 = vsubps_avx(auVar84,auVar281);
            local_3b8._0_4_ = auVar188._0_4_;
            local_3b8._4_4_ = auVar188._4_4_;
            fStack_3b0 = auVar188._8_4_;
            fStack_3ac = auVar188._12_4_;
            fVar148 = auVar281._0_4_;
            auVar85._0_4_ = fVar148 * (float)local_3b8._0_4_;
            fVar147 = auVar281._4_4_;
            auVar85._4_4_ = fVar147 * (float)local_3b8._4_4_;
            fVar95 = auVar281._8_4_;
            auVar85._8_4_ = fVar95 * fStack_3b0;
            fVar146 = auVar281._12_4_;
            auVar85._12_4_ = fVar146 * fStack_3ac;
            auVar215._0_4_ = fVar148 * auVar167._0_4_;
            auVar215._4_4_ = fVar147 * auVar167._4_4_;
            auVar215._8_4_ = fVar95 * auVar167._8_4_;
            auVar215._12_4_ = fVar146 * auVar167._12_4_;
            auVar229._0_4_ = fVar148 * auVar189._0_4_;
            auVar229._4_4_ = fVar147 * auVar189._4_4_;
            auVar229._8_4_ = fVar95 * auVar189._8_4_;
            auVar229._12_4_ = fVar146 * auVar189._12_4_;
            local_418._0_4_ = auVar20._0_4_;
            local_418._4_4_ = auVar20._4_4_;
            fStack_410 = auVar20._8_4_;
            fStack_40c = auVar20._12_4_;
            auVar246._0_4_ = fVar148 * (float)local_418._0_4_;
            auVar246._4_4_ = fVar147 * (float)local_418._4_4_;
            auVar246._8_4_ = fVar95 * fStack_410;
            auVar246._12_4_ = fVar146 * fStack_40c;
            auVar167 = vfmadd231ps_fma(auVar85,auVar70,auVar177);
            auVar189 = vfmadd231ps_fma(auVar215,auVar70,auVar255);
            auVar281 = vfmadd231ps_fma(auVar229,auVar70,auVar268);
            auVar70 = vfmadd231ps_fma(auVar246,auVar70,ZEXT816(0));
            auVar188 = vmovshdup_avx(auVar78);
            auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar188._0_4_ * auVar159._0_4_)),auVar78,
                                       ZEXT416((uint)(1.0 - auVar159._0_4_)));
            auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar188._0_4_ * auVar290._0_4_)),auVar78,
                                       ZEXT416((uint)(1.0 - auVar290._0_4_)));
            fVar148 = 1.0 / fVar67;
            auVar159 = vsubps_avx(auVar189,auVar167);
            auVar256._0_4_ = auVar159._0_4_ * 3.0;
            auVar256._4_4_ = auVar159._4_4_ * 3.0;
            auVar256._8_4_ = auVar159._8_4_ * 3.0;
            auVar256._12_4_ = auVar159._12_4_ * 3.0;
            auVar159 = vsubps_avx(auVar281,auVar189);
            auVar269._0_4_ = auVar159._0_4_ * 3.0;
            auVar269._4_4_ = auVar159._4_4_ * 3.0;
            auVar269._8_4_ = auVar159._8_4_ * 3.0;
            auVar269._12_4_ = auVar159._12_4_ * 3.0;
            auVar159 = vsubps_avx(auVar70,auVar281);
            auVar282._0_4_ = auVar159._0_4_ * 3.0;
            auVar282._4_4_ = auVar159._4_4_ * 3.0;
            auVar282._8_4_ = auVar159._8_4_ * 3.0;
            auVar282._12_4_ = auVar159._12_4_ * 3.0;
            auVar188 = vminps_avx(auVar269,auVar282);
            auVar159 = vmaxps_avx(auVar269,auVar282);
            auVar188 = vminps_avx(auVar256,auVar188);
            auVar159 = vmaxps_avx(auVar256,auVar159);
            auVar20 = vshufpd_avx(auVar188,auVar188,3);
            auVar290 = vshufpd_avx(auVar159,auVar159,3);
            auVar188 = vminps_avx(auVar188,auVar20);
            auVar159 = vmaxps_avx(auVar159,auVar290);
            auVar270._0_4_ = auVar188._0_4_ * fVar148;
            auVar270._4_4_ = auVar188._4_4_ * fVar148;
            auVar270._8_4_ = auVar188._8_4_ * fVar148;
            auVar270._12_4_ = auVar188._12_4_ * fVar148;
            auVar257._0_4_ = auVar159._0_4_ * fVar148;
            auVar257._4_4_ = auVar159._4_4_ * fVar148;
            auVar257._8_4_ = auVar159._8_4_ * fVar148;
            auVar257._12_4_ = auVar159._12_4_ * fVar148;
            fVar148 = 1.0 / (auVar106._0_4_ - auVar100._0_4_);
            auVar159 = vshufpd_avx(auVar167,auVar167,3);
            auVar188 = vshufpd_avx(auVar189,auVar189,3);
            auVar20 = vshufpd_avx(auVar281,auVar281,3);
            auVar290 = vshufpd_avx(auVar70,auVar70,3);
            auVar159 = vsubps_avx(auVar159,auVar167);
            auVar167 = vsubps_avx(auVar188,auVar189);
            auVar189 = vsubps_avx(auVar20,auVar281);
            auVar290 = vsubps_avx(auVar290,auVar70);
            auVar188 = vminps_avx(auVar159,auVar167);
            auVar159 = vmaxps_avx(auVar159,auVar167);
            auVar20 = vminps_avx(auVar189,auVar290);
            auVar20 = vminps_avx(auVar188,auVar20);
            auVar188 = vmaxps_avx(auVar189,auVar290);
            auVar159 = vmaxps_avx(auVar159,auVar188);
            auVar302._0_4_ = fVar148 * auVar20._0_4_;
            auVar302._4_4_ = fVar148 * auVar20._4_4_;
            auVar302._8_4_ = fVar148 * auVar20._8_4_;
            auVar302._12_4_ = fVar148 * auVar20._12_4_;
            auVar291._0_4_ = fVar148 * auVar159._0_4_;
            auVar291._4_4_ = fVar148 * auVar159._4_4_;
            auVar291._8_4_ = fVar148 * auVar159._8_4_;
            auVar291._12_4_ = fVar148 * auVar159._12_4_;
            auVar290 = vinsertps_avx(auVar21,auVar100,0x10);
            auVar167 = vinsertps_avx(auVar16,auVar106,0x10);
            auVar283._0_4_ = (auVar290._0_4_ + auVar167._0_4_) * 0.5;
            auVar283._4_4_ = (auVar290._4_4_ + auVar167._4_4_) * 0.5;
            auVar283._8_4_ = (auVar290._8_4_ + auVar167._8_4_) * 0.5;
            auVar283._12_4_ = (auVar290._12_4_ + auVar167._12_4_) * 0.5;
            auVar86._4_4_ = auVar283._0_4_;
            auVar86._0_4_ = auVar283._0_4_;
            auVar86._8_4_ = auVar283._0_4_;
            auVar86._12_4_ = auVar283._0_4_;
            auVar159 = vfmadd213ps_fma(local_1e8,auVar86,_local_4b8);
            auVar188 = vfmadd213ps_fma(local_1f8,auVar86,auVar17);
            auVar20 = vfmadd213ps_fma(local_208,auVar86,auVar18);
            auVar16 = vsubps_avx(auVar188,auVar159);
            auVar159 = vfmadd213ps_fma(auVar16,auVar86,auVar159);
            auVar16 = vsubps_avx(auVar20,auVar188);
            auVar16 = vfmadd213ps_fma(auVar16,auVar86,auVar188);
            auVar16 = vsubps_avx(auVar16,auVar159);
            auVar159 = vfmadd231ps_fma(auVar159,auVar16,auVar86);
            auVar87._0_8_ = CONCAT44(auVar16._4_4_ * 3.0,auVar16._0_4_ * 3.0);
            auVar87._8_4_ = auVar16._8_4_ * 3.0;
            auVar87._12_4_ = auVar16._12_4_ * 3.0;
            auVar315._8_8_ = auVar159._0_8_;
            auVar315._0_8_ = auVar159._0_8_;
            auVar16 = vshufpd_avx(auVar159,auVar159,3);
            auVar159 = vshufps_avx(auVar283,auVar283,0x55);
            auVar281 = vsubps_avx(auVar16,auVar315);
            auVar69 = vfmadd231ps_fma(auVar315,auVar159,auVar281);
            auVar322._8_8_ = auVar87._0_8_;
            auVar322._0_8_ = auVar87._0_8_;
            auVar16 = vshufpd_avx(auVar87,auVar87,3);
            auVar16 = vsubps_avx(auVar16,auVar322);
            auVar70 = vfmadd213ps_fma(auVar16,auVar159,auVar322);
            auVar159 = vmovshdup_avx(auVar70);
            auVar323._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
            auVar323._8_4_ = auVar159._8_4_ ^ 0x80000000;
            auVar323._12_4_ = auVar159._12_4_ ^ 0x80000000;
            auVar188 = vmovshdup_avx(auVar281);
            auVar16 = vunpcklps_avx(auVar188,auVar323);
            auVar20 = vshufps_avx(auVar16,auVar323,4);
            auVar189 = vshufps_avx(auVar283,auVar283,0x54);
            auVar161._0_8_ = auVar281._0_8_ ^ 0x8000000080000000;
            auVar161._8_4_ = auVar281._8_4_ ^ 0x80000000;
            auVar161._12_4_ = auVar281._12_4_ ^ 0x80000000;
            auVar16 = vmovlhps_avx(auVar161,auVar70);
            auVar16 = vshufps_avx(auVar16,auVar70,8);
            auVar159 = vfmsub231ss_fma(ZEXT416((uint)(auVar281._0_4_ * auVar159._0_4_)),auVar188,
                                       auVar70);
            uVar68 = auVar159._0_4_;
            auVar88._4_4_ = uVar68;
            auVar88._0_4_ = uVar68;
            auVar88._8_4_ = uVar68;
            auVar88._12_4_ = uVar68;
            auVar159 = vdivps_avx(auVar20,auVar88);
            auVar188 = vdivps_avx(auVar16,auVar88);
            fVar95 = auVar69._0_4_;
            fVar148 = auVar159._0_4_;
            auVar16 = vshufps_avx(auVar69,auVar69,0x55);
            fVar147 = auVar188._0_4_;
            auVar89._0_4_ = fVar95 * fVar148 + auVar16._0_4_ * fVar147;
            auVar89._4_4_ = fVar95 * auVar159._4_4_ + auVar16._4_4_ * auVar188._4_4_;
            auVar89._8_4_ = fVar95 * auVar159._8_4_ + auVar16._8_4_ * auVar188._8_4_;
            auVar89._12_4_ = fVar95 * auVar159._12_4_ + auVar16._12_4_ * auVar188._12_4_;
            auVar99 = vsubps_avx(auVar189,auVar89);
            auVar189 = vmovshdup_avx(auVar159);
            auVar16 = vinsertps_avx(auVar270,auVar302,0x1c);
            auVar194._0_4_ = auVar189._0_4_ * auVar16._0_4_;
            auVar194._4_4_ = auVar189._4_4_ * auVar16._4_4_;
            auVar194._8_4_ = auVar189._8_4_ * auVar16._8_4_;
            auVar194._12_4_ = auVar189._12_4_ * auVar16._12_4_;
            auVar20 = vinsertps_avx(auVar257,auVar291,0x1c);
            auVar116._0_4_ = auVar20._0_4_ * auVar189._0_4_;
            auVar116._4_4_ = auVar20._4_4_ * auVar189._4_4_;
            auVar116._8_4_ = auVar20._8_4_ * auVar189._8_4_;
            auVar116._12_4_ = auVar20._12_4_ * auVar189._12_4_;
            auVar69 = vminps_avx(auVar194,auVar116);
            auVar70 = vmaxps_avx(auVar116,auVar194);
            auVar189 = vinsertps_avx(auVar302,auVar270,0x4c);
            auVar156 = vmovshdup_avx(auVar188);
            auVar281 = vinsertps_avx(auVar291,auVar257,0x4c);
            auVar292._0_4_ = auVar156._0_4_ * auVar189._0_4_;
            auVar292._4_4_ = auVar156._4_4_ * auVar189._4_4_;
            auVar292._8_4_ = auVar156._8_4_ * auVar189._8_4_;
            auVar292._12_4_ = auVar156._12_4_ * auVar189._12_4_;
            auVar271._0_4_ = auVar156._0_4_ * auVar281._0_4_;
            auVar271._4_4_ = auVar156._4_4_ * auVar281._4_4_;
            auVar271._8_4_ = auVar156._8_4_ * auVar281._8_4_;
            auVar271._12_4_ = auVar156._12_4_ * auVar281._12_4_;
            auVar156 = vminps_avx(auVar292,auVar271);
            auVar303._0_4_ = auVar69._0_4_ + auVar156._0_4_;
            auVar303._4_4_ = auVar69._4_4_ + auVar156._4_4_;
            auVar303._8_4_ = auVar69._8_4_ + auVar156._8_4_;
            auVar303._12_4_ = auVar69._12_4_ + auVar156._12_4_;
            auVar69 = vmaxps_avx(auVar271,auVar292);
            auVar117._0_4_ = auVar69._0_4_ + auVar70._0_4_;
            auVar117._4_4_ = auVar69._4_4_ + auVar70._4_4_;
            auVar117._8_4_ = auVar69._8_4_ + auVar70._8_4_;
            auVar117._12_4_ = auVar69._12_4_ + auVar70._12_4_;
            auVar272._8_8_ = 0x3f80000000000000;
            auVar272._0_8_ = 0x3f80000000000000;
            auVar70 = vsubps_avx(auVar272,auVar117);
            auVar69 = vsubps_avx(auVar272,auVar303);
            auVar156 = vsubps_avx(auVar290,auVar283);
            auVar98 = vsubps_avx(auVar167,auVar283);
            auVar137._0_4_ = fVar148 * auVar16._0_4_;
            auVar137._4_4_ = fVar148 * auVar16._4_4_;
            auVar137._8_4_ = fVar148 * auVar16._8_4_;
            auVar137._12_4_ = fVar148 * auVar16._12_4_;
            auVar304._0_4_ = fVar148 * auVar20._0_4_;
            auVar304._4_4_ = fVar148 * auVar20._4_4_;
            auVar304._8_4_ = fVar148 * auVar20._8_4_;
            auVar304._12_4_ = fVar148 * auVar20._12_4_;
            auVar20 = vminps_avx(auVar137,auVar304);
            auVar16 = vmaxps_avx(auVar304,auVar137);
            auVar195._0_4_ = fVar147 * auVar189._0_4_;
            auVar195._4_4_ = fVar147 * auVar189._4_4_;
            auVar195._8_4_ = fVar147 * auVar189._8_4_;
            auVar195._12_4_ = fVar147 * auVar189._12_4_;
            auVar258._0_4_ = fVar147 * auVar281._0_4_;
            auVar258._4_4_ = fVar147 * auVar281._4_4_;
            auVar258._8_4_ = fVar147 * auVar281._8_4_;
            auVar258._12_4_ = fVar147 * auVar281._12_4_;
            auVar189 = vminps_avx(auVar195,auVar258);
            auVar305._0_4_ = auVar20._0_4_ + auVar189._0_4_;
            auVar305._4_4_ = auVar20._4_4_ + auVar189._4_4_;
            auVar305._8_4_ = auVar20._8_4_ + auVar189._8_4_;
            auVar305._12_4_ = auVar20._12_4_ + auVar189._12_4_;
            fVar145 = auVar156._0_4_;
            auVar316._0_4_ = fVar145 * auVar70._0_4_;
            fVar181 = auVar156._4_4_;
            auVar316._4_4_ = fVar181 * auVar70._4_4_;
            fVar182 = auVar156._8_4_;
            auVar316._8_4_ = fVar182 * auVar70._8_4_;
            fVar183 = auVar156._12_4_;
            auVar316._12_4_ = fVar183 * auVar70._12_4_;
            auVar20 = vmaxps_avx(auVar258,auVar195);
            auVar259._0_4_ = fVar145 * auVar69._0_4_;
            auVar259._4_4_ = fVar181 * auVar69._4_4_;
            auVar259._8_4_ = fVar182 * auVar69._8_4_;
            auVar259._12_4_ = fVar183 * auVar69._12_4_;
            fVar95 = auVar98._0_4_;
            auVar118._0_4_ = fVar95 * auVar70._0_4_;
            fVar146 = auVar98._4_4_;
            auVar118._4_4_ = fVar146 * auVar70._4_4_;
            fVar125 = auVar98._8_4_;
            auVar118._8_4_ = fVar125 * auVar70._8_4_;
            fVar143 = auVar98._12_4_;
            auVar118._12_4_ = fVar143 * auVar70._12_4_;
            auVar273._0_4_ = fVar95 * auVar69._0_4_;
            auVar273._4_4_ = fVar146 * auVar69._4_4_;
            auVar273._8_4_ = fVar125 * auVar69._8_4_;
            auVar273._12_4_ = fVar143 * auVar69._12_4_;
            auVar138._0_4_ = auVar16._0_4_ + auVar20._0_4_;
            auVar138._4_4_ = auVar16._4_4_ + auVar20._4_4_;
            auVar138._8_4_ = auVar16._8_4_ + auVar20._8_4_;
            auVar138._12_4_ = auVar16._12_4_ + auVar20._12_4_;
            auVar196._8_8_ = 0x3f800000;
            auVar196._0_8_ = 0x3f800000;
            auVar16 = vsubps_avx(auVar196,auVar138);
            auVar20 = vsubps_avx(auVar196,auVar305);
            auVar306._0_4_ = fVar145 * auVar16._0_4_;
            auVar306._4_4_ = fVar181 * auVar16._4_4_;
            auVar306._8_4_ = fVar182 * auVar16._8_4_;
            auVar306._12_4_ = fVar183 * auVar16._12_4_;
            auVar293._0_4_ = fVar145 * auVar20._0_4_;
            auVar293._4_4_ = fVar181 * auVar20._4_4_;
            auVar293._8_4_ = fVar182 * auVar20._8_4_;
            auVar293._12_4_ = fVar183 * auVar20._12_4_;
            auVar139._0_4_ = fVar95 * auVar16._0_4_;
            auVar139._4_4_ = fVar146 * auVar16._4_4_;
            auVar139._8_4_ = fVar125 * auVar16._8_4_;
            auVar139._12_4_ = fVar143 * auVar16._12_4_;
            auVar197._0_4_ = fVar95 * auVar20._0_4_;
            auVar197._4_4_ = fVar146 * auVar20._4_4_;
            auVar197._8_4_ = fVar125 * auVar20._8_4_;
            auVar197._12_4_ = fVar143 * auVar20._12_4_;
            auVar16 = vminps_avx(auVar306,auVar293);
            auVar20 = vminps_avx(auVar139,auVar197);
            auVar16 = vminps_avx(auVar16,auVar20);
            auVar20 = vmaxps_avx(auVar293,auVar306);
            auVar189 = vmaxps_avx(auVar197,auVar139);
            auVar281 = vminps_avx(auVar316,auVar259);
            auVar70 = vminps_avx(auVar118,auVar273);
            auVar281 = vminps_avx(auVar281,auVar70);
            auVar16 = vhaddps_avx(auVar16,auVar281);
            auVar20 = vmaxps_avx(auVar189,auVar20);
            auVar189 = vmaxps_avx(auVar259,auVar316);
            auVar281 = vmaxps_avx(auVar273,auVar118);
            auVar189 = vmaxps_avx(auVar281,auVar189);
            auVar20 = vhaddps_avx(auVar20,auVar189);
            auVar16 = vshufps_avx(auVar16,auVar16,0xe8);
            auVar20 = vshufps_avx(auVar20,auVar20,0xe8);
            auVar274._0_4_ = auVar99._0_4_ + auVar16._0_4_;
            auVar274._4_4_ = auVar99._4_4_ + auVar16._4_4_;
            auVar274._8_4_ = auVar99._8_4_ + auVar16._8_4_;
            auVar274._12_4_ = auVar99._12_4_ + auVar16._12_4_;
            auVar260._0_4_ = auVar99._0_4_ + auVar20._0_4_;
            auVar260._4_4_ = auVar99._4_4_ + auVar20._4_4_;
            auVar260._8_4_ = auVar99._8_4_ + auVar20._8_4_;
            auVar260._12_4_ = auVar99._12_4_ + auVar20._12_4_;
            auVar263 = ZEXT1664(auVar260);
            auVar16 = vmaxps_avx(auVar290,auVar274);
            auVar20 = vminps_avx(auVar260,auVar167);
            auVar16 = vcmpps_avx(auVar20,auVar16,1);
            auVar16 = vshufps_avx(auVar16,auVar16,0x50);
            if ((auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar16[0xf]) {
              bVar62 = 0;
              if ((auVar235._0_4_ < auVar274._0_4_) && (bVar62 = 0, auVar260._0_4_ < auVar167._0_4_)
                 ) {
                auVar20 = vmovshdup_avx(auVar274);
                auVar16 = vcmpps_avx(auVar260,auVar167,1);
                bVar62 = auVar16[4] & auVar100._0_4_ < auVar20._0_4_;
              }
              if (((3 < uVar65 || fVar67 < 0.001) | bVar62) != 1) goto LAB_016d705a;
              lVar61 = 200;
              do {
                fVar146 = auVar99._0_4_;
                fVar95 = 1.0 - fVar146;
                fVar67 = fVar95 * fVar95 * fVar95;
                fVar94 = fVar146 * 3.0 * fVar95 * fVar95;
                fVar95 = fVar95 * fVar146 * fVar146 * 3.0;
                auVar178._4_4_ = fVar67;
                auVar178._0_4_ = fVar67;
                auVar178._8_4_ = fVar67;
                auVar178._12_4_ = fVar67;
                auVar140._4_4_ = fVar94;
                auVar140._0_4_ = fVar94;
                auVar140._8_4_ = fVar94;
                auVar140._12_4_ = fVar94;
                auVar119._4_4_ = fVar95;
                auVar119._0_4_ = fVar95;
                auVar119._8_4_ = fVar95;
                auVar119._12_4_ = fVar95;
                fVar146 = fVar146 * fVar146 * fVar146;
                auVar198._0_4_ = fVar146 * (float)local_4a8._0_4_;
                auVar198._4_4_ = fVar146 * (float)local_4a8._4_4_;
                auVar198._8_4_ = fVar146 * fStack_4a0;
                auVar198._12_4_ = fVar146 * fStack_49c;
                auVar21 = vfmadd231ps_fma(auVar198,auVar119,auVar18);
                auVar21 = vfmadd231ps_fma(auVar21,auVar140,auVar17);
                auVar21 = vfmadd231ps_fma(auVar21,_local_4b8,auVar178);
                auVar120._8_8_ = auVar21._0_8_;
                auVar120._0_8_ = auVar21._0_8_;
                auVar21 = vshufpd_avx(auVar21,auVar21,3);
                auVar16 = vshufps_avx(auVar99,auVar99,0x55);
                auVar21 = vsubps_avx(auVar21,auVar120);
                auVar16 = vfmadd213ps_fma(auVar21,auVar16,auVar120);
                fVar67 = auVar16._0_4_;
                auVar21 = vshufps_avx(auVar16,auVar16,0x55);
                auVar121._0_4_ = fVar148 * fVar67 + fVar147 * auVar21._0_4_;
                auVar121._4_4_ = auVar159._4_4_ * fVar67 + auVar188._4_4_ * auVar21._4_4_;
                auVar121._8_4_ = auVar159._8_4_ * fVar67 + auVar188._8_4_ * auVar21._8_4_;
                auVar121._12_4_ = auVar159._12_4_ * fVar67 + auVar188._12_4_ * auVar21._12_4_;
                auVar99 = vsubps_avx(auVar99,auVar121);
                auVar21 = vandps_avx(local_2b8,auVar16);
                auVar16 = vshufps_avx(auVar21,auVar21,0xf5);
                auVar21 = vmaxss_avx(auVar16,auVar21);
                if (auVar21._0_4_ < (float)local_438._0_4_) {
                  fVar67 = auVar99._0_4_;
                  if ((0.0 <= fVar67) && (fVar67 <= 1.0)) {
                    auVar21 = vmovshdup_avx(auVar99);
                    fVar94 = auVar21._0_4_;
                    if ((0.0 <= fVar94) && (fVar94 <= 1.0)) {
                      auVar21 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                              ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                              0x1c);
                      auVar189 = vinsertps_avx(auVar21,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                     m128[2]),0x28);
                      aVar5 = (ray->super_RayK<1>).org.field_0;
                      auVar21 = vsubps_avx(local_348,(undefined1  [16])aVar5);
                      auVar21 = vdpps_avx(auVar21,auVar189,0x7f);
                      auVar16 = vsubps_avx(local_358,(undefined1  [16])aVar5);
                      auVar16 = vdpps_avx(auVar16,auVar189,0x7f);
                      auVar159 = vsubps_avx(local_368,(undefined1  [16])aVar5);
                      auVar159 = vdpps_avx(auVar159,auVar189,0x7f);
                      auVar188 = vsubps_avx(local_378,(undefined1  [16])aVar5);
                      auVar188 = vdpps_avx(auVar188,auVar189,0x7f);
                      auVar20 = vsubps_avx(_local_388,(undefined1  [16])aVar5);
                      auVar20 = vdpps_avx(auVar20,auVar189,0x7f);
                      auVar290 = vsubps_avx(_local_398,(undefined1  [16])aVar5);
                      auVar290 = vdpps_avx(auVar290,auVar189,0x7f);
                      auVar167 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
                      auVar167 = vdpps_avx(auVar167,auVar189,0x7f);
                      auVar281 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
                      auVar189 = vdpps_avx(auVar281,auVar189,0x7f);
                      fVar148 = 1.0 - fVar94;
                      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar94)),
                                                ZEXT416((uint)fVar148),auVar21);
                      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar290._0_4_ * fVar94)),
                                                ZEXT416((uint)fVar148),auVar16);
                      auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar167._0_4_ * fVar94)),
                                                 ZEXT416((uint)fVar148),auVar159);
                      auVar263 = ZEXT1664(auVar159);
                      auVar188 = vfmadd231ss_fma(ZEXT416((uint)(fVar94 * auVar189._0_4_)),
                                                 ZEXT416((uint)fVar148),auVar188);
                      fVar95 = 1.0 - fVar67;
                      fVar94 = fVar95 * fVar67 * fVar67 * 3.0;
                      fVar125 = fVar67 * fVar67 * fVar67;
                      auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar188._0_4_ * fVar125)),
                                                 ZEXT416((uint)fVar94),auVar159);
                      fVar148 = fVar67 * 3.0 * fVar95 * fVar95;
                      auVar16 = vfmadd231ss_fma(auVar159,ZEXT416((uint)fVar148),auVar16);
                      fVar147 = fVar95 * fVar95 * fVar95;
                      auVar21 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar147),auVar21);
                      fVar146 = auVar21._0_4_;
                      if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar146) &&
                          (fVar143 = (ray->super_RayK<1>).tfar, fVar146 <= fVar143)) &&
                         (pGVar8 = (context->scene->geometries).items[uVar58].ptr,
                         (pGVar8->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar21 = vshufps_avx(auVar99,auVar99,0x55);
                        auVar247._8_4_ = 0x3f800000;
                        auVar247._0_8_ = 0x3f8000003f800000;
                        auVar247._12_4_ = 0x3f800000;
                        auVar16 = vsubps_avx(auVar247,auVar21);
                        fVar145 = auVar21._0_4_;
                        auVar261._0_4_ = fVar145 * (float)local_388._0_4_;
                        fVar181 = auVar21._4_4_;
                        auVar261._4_4_ = fVar181 * (float)local_388._4_4_;
                        fVar182 = auVar21._8_4_;
                        auVar261._8_4_ = fVar182 * fStack_380;
                        fVar183 = auVar21._12_4_;
                        auVar261._12_4_ = fVar183 * fStack_37c;
                        auVar275._0_4_ = fVar145 * (float)local_398._0_4_;
                        auVar275._4_4_ = fVar181 * (float)local_398._4_4_;
                        auVar275._8_4_ = fVar182 * fStack_390;
                        auVar275._12_4_ = fVar183 * fStack_38c;
                        auVar284._0_4_ = fVar145 * (float)local_3c8._0_4_;
                        auVar284._4_4_ = fVar181 * (float)local_3c8._4_4_;
                        auVar284._8_4_ = fVar182 * fStack_3c0;
                        auVar284._12_4_ = fVar183 * fStack_3bc;
                        auVar230._0_4_ = fVar145 * (float)local_3d8._0_4_;
                        auVar230._4_4_ = fVar181 * (float)local_3d8._4_4_;
                        auVar230._8_4_ = fVar182 * fStack_3d0;
                        auVar230._12_4_ = fVar183 * fStack_3cc;
                        auVar21 = vfmadd231ps_fma(auVar261,auVar16,local_348);
                        auVar159 = vfmadd231ps_fma(auVar275,auVar16,local_358);
                        auVar188 = vfmadd231ps_fma(auVar284,auVar16,local_368);
                        auVar20 = vfmadd231ps_fma(auVar230,auVar16,local_378);
                        auVar21 = vsubps_avx(auVar159,auVar21);
                        auVar16 = vsubps_avx(auVar188,auVar159);
                        auVar263 = ZEXT1664(auVar16);
                        auVar159 = vsubps_avx(auVar20,auVar188);
                        auVar285._0_4_ = fVar67 * auVar16._0_4_;
                        auVar285._4_4_ = fVar67 * auVar16._4_4_;
                        auVar285._8_4_ = fVar67 * auVar16._8_4_;
                        auVar285._12_4_ = fVar67 * auVar16._12_4_;
                        auVar216._4_4_ = fVar95;
                        auVar216._0_4_ = fVar95;
                        auVar216._8_4_ = fVar95;
                        auVar216._12_4_ = fVar95;
                        auVar21 = vfmadd231ps_fma(auVar285,auVar216,auVar21);
                        auVar231._0_4_ = fVar67 * auVar159._0_4_;
                        auVar231._4_4_ = fVar67 * auVar159._4_4_;
                        auVar231._8_4_ = fVar67 * auVar159._8_4_;
                        auVar231._12_4_ = fVar67 * auVar159._12_4_;
                        auVar159 = vfmadd231ps_fma(auVar231,auVar216,auVar16);
                        auVar232._0_4_ = fVar67 * auVar159._0_4_;
                        auVar232._4_4_ = fVar67 * auVar159._4_4_;
                        auVar232._8_4_ = fVar67 * auVar159._8_4_;
                        auVar232._12_4_ = fVar67 * auVar159._12_4_;
                        auVar159 = vfmadd231ps_fma(auVar232,auVar216,auVar21);
                        auVar199._0_4_ = fVar125 * (float)local_258._0_4_;
                        auVar199._4_4_ = fVar125 * (float)local_258._4_4_;
                        auVar199._8_4_ = fVar125 * fStack_250;
                        auVar199._12_4_ = fVar125 * fStack_24c;
                        auVar141._4_4_ = fVar94;
                        auVar141._0_4_ = fVar94;
                        auVar141._8_4_ = fVar94;
                        auVar141._12_4_ = fVar94;
                        auVar21 = vfmadd132ps_fma(auVar141,auVar199,local_248);
                        auVar179._4_4_ = fVar148;
                        auVar179._0_4_ = fVar148;
                        auVar179._8_4_ = fVar148;
                        auVar179._12_4_ = fVar148;
                        auVar21 = vfmadd132ps_fma(auVar179,auVar21,local_238);
                        auVar200._0_4_ = auVar159._0_4_ * 3.0;
                        auVar200._4_4_ = auVar159._4_4_ * 3.0;
                        auVar200._8_4_ = auVar159._8_4_ * 3.0;
                        auVar200._12_4_ = auVar159._12_4_ * 3.0;
                        auVar162._4_4_ = fVar147;
                        auVar162._0_4_ = fVar147;
                        auVar162._8_4_ = fVar147;
                        auVar162._12_4_ = fVar147;
                        auVar159 = vfmadd132ps_fma(auVar162,auVar21,local_228);
                        auVar21 = vshufps_avx(auVar200,auVar200,0xc9);
                        auVar142._0_4_ = auVar159._0_4_ * auVar21._0_4_;
                        auVar142._4_4_ = auVar159._4_4_ * auVar21._4_4_;
                        auVar142._8_4_ = auVar159._8_4_ * auVar21._8_4_;
                        auVar142._12_4_ = auVar159._12_4_ * auVar21._12_4_;
                        auVar21 = vshufps_avx(auVar159,auVar159,0xc9);
                        auVar21 = vfmsub231ps_fma(auVar142,auVar200,auVar21);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar146;
                          auVar16 = vshufps_avx(auVar21,auVar21,0xe9);
                          uVar97 = vmovlps_avx(auVar16);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar97;
                          (ray->Ng).field_0.field_0.z = auVar21._0_4_;
                          uVar97 = vmovlps_avx(auVar99);
                          ray->u = (float)(int)uVar97;
                          ray->v = (float)(int)((ulong)uVar97 >> 0x20);
                          ray->primID = (uint)local_420;
                          ray->geomID = uVar58;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_4d8._0_4_ = fVar143;
                          auVar159 = vshufps_avx(auVar21,auVar21,0xe9);
                          local_298 = vmovlps_avx(auVar159);
                          local_290 = auVar21._0_4_;
                          local_28c = vmovlps_avx(auVar99);
                          local_284 = (uint)local_420;
                          local_280 = uVar58;
                          local_27c = context->user->instID[0];
                          local_278 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar146;
                          local_4dc = -1;
                          local_2e8.valid = &local_4dc;
                          local_2e8.geometryUserPtr = pGVar8->userPtr;
                          local_2e8.context = context->user;
                          local_2e8.ray = (RTCRayN *)ray;
                          local_2e8.hit = (RTCHitN *)&local_298;
                          local_2e8.N = 1;
                          if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016d6f18:
                            p_Var14 = context->args->filter;
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar263 = ZEXT1664(auVar263._0_16_);
                              (*p_Var14)(&local_2e8);
                              if (*local_2e8.valid == 0) goto LAB_016d6fbc;
                            }
                            (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_2e8.hit;
                            (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_2e8.hit + 4);
                            (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_2e8.hit + 8);
                            *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc)
                            ;
                            *(float *)((long)local_2e8.ray + 0x40) =
                                 *(float *)(local_2e8.hit + 0x10);
                            *(float *)((long)local_2e8.ray + 0x44) =
                                 *(float *)(local_2e8.hit + 0x14);
                            *(float *)((long)local_2e8.ray + 0x48) =
                                 *(float *)(local_2e8.hit + 0x18);
                            *(float *)((long)local_2e8.ray + 0x4c) =
                                 *(float *)(local_2e8.hit + 0x1c);
                            *(float *)((long)local_2e8.ray + 0x50) =
                                 *(float *)(local_2e8.hit + 0x20);
                          }
                          else {
                            auVar263 = ZEXT1664(auVar16);
                            (*pGVar8->intersectionFilterN)(&local_2e8);
                            if (*local_2e8.valid != 0) goto LAB_016d6f18;
LAB_016d6fbc:
                            (ray->super_RayK<1>).tfar = (float)local_4d8._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar61 = lVar61 + -1;
              } while (lVar61 != 0);
            }
          }
        }
        else {
          auVar290 = vcmpps_avx(auVar290,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar189 = vcmpps_avx(auVar167,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar290 = vandps_avx(auVar189,auVar290);
          if (-0.0001 < fVar147 && (auVar290 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_016d64f5;
        }
        if (uVar65 == 0) break;
      } while( true );
    }
    fVar67 = (ray->super_RayK<1>).tfar;
    auVar90._4_4_ = fVar67;
    auVar90._0_4_ = fVar67;
    auVar90._8_4_ = fVar67;
    auVar90._12_4_ = fVar67;
    auVar21 = vcmpps_avx(local_268,auVar90,2);
    uVar58 = vmovmskps_avx(auVar21);
    uVar57 = uVar57 & uVar57 + 0xf & uVar58;
    if (uVar57 == 0) {
      return;
    }
  } while( true );
LAB_016d705a:
  local_218 = vinsertps_avx(auVar21,ZEXT416((uint)fVar94),0x10);
  auVar78 = vinsertps_avx(auVar100,ZEXT416((uint)auVar106._0_4_),0x10);
  goto LAB_016d5c3a;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }